

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_opt_gen.cpp
# Opt level: O1

void get_msurf_descriptor_haar_unroll_4_6_True(integral_image *iimage,interest_point *ipoint)

{
  int iVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  undefined1 auVar6 [32];
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  ulong uVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  int iVar28;
  float *data;
  int c2;
  int iVar29;
  int iVar30;
  int iVar31;
  uint uVar32;
  int iVar33;
  ulong uVar34;
  int iVar35;
  int iVar36;
  int iVar37;
  int iVar38;
  int iVar39;
  ulong uVar40;
  int c1;
  long lVar41;
  int iVar42;
  ulong uVar43;
  int iVar44;
  int iVar45;
  int iVar46;
  int iVar47;
  int iVar48;
  int iVar49;
  int iVar50;
  uint uVar51;
  long lVar52;
  float *pfVar53;
  float *pfVar54;
  long lVar55;
  long lVar56;
  int c2_4;
  float *pfVar57;
  int c2_2;
  int iVar58;
  int iVar59;
  long lVar60;
  long lVar61;
  long lVar62;
  long lVar63;
  int iVar64;
  ulong uVar65;
  byte bVar66;
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [32];
  float fVar80;
  float fVar81;
  float fVar82;
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [32];
  undefined1 auVar86 [16];
  float fVar87;
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [64];
  undefined1 auVar102 [64];
  float fVar103;
  undefined1 auVar105 [12];
  undefined1 auVar104 [64];
  undefined1 in_ZMM8 [64];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [64];
  int data_width;
  float local_118;
  
  auVar74._8_4_ = 0x80000000;
  auVar74._0_8_ = 0x8000000080000000;
  auVar74._12_4_ = 0x80000000;
  auVar102 = ZEXT1664(auVar74);
  auVar75._8_4_ = 0x3effffff;
  auVar75._0_8_ = 0x3effffff3effffff;
  auVar75._12_4_ = 0x3effffff;
  auVar104 = ZEXT1664(auVar75);
  fVar82 = ipoint->scale;
  auVar108 = ZEXT464((uint)fVar82);
  auVar67 = vpternlogd_avx512vl(auVar75,ZEXT416((uint)fVar82),auVar74,0xf8);
  auVar67 = ZEXT416((uint)(fVar82 + auVar67._0_4_));
  auVar67 = vroundss_avx(auVar67,auVar67,0xb);
  iVar64 = (int)auVar67._0_4_;
  fVar80 = -0.08 / (fVar82 * fVar82);
  auVar68 = vpternlogd_avx512vl(auVar75,ZEXT416((uint)ipoint->x),auVar74,0xf8);
  auVar68 = ZEXT416((uint)(ipoint->x + auVar68._0_4_));
  auVar68 = vroundss_avx(auVar68,auVar68,0xb);
  auVar69._0_8_ = (double)auVar68._0_4_;
  auVar69._8_8_ = auVar68._8_8_;
  auVar73._0_8_ = (double)fVar82;
  auVar73._8_8_ = 0;
  auVar71 = ZEXT816(0x3fe0000000000000);
  auVar101 = ZEXT1664(auVar71);
  auVar68 = vfmadd231sd_fma(auVar69,auVar73,auVar71);
  auVar72._0_4_ = (float)auVar68._0_8_;
  auVar72._4_12_ = auVar68._4_12_;
  auVar68 = vpternlogd_avx512vl(auVar75,ZEXT416((uint)ipoint->y),auVar74,0xf8);
  auVar68 = ZEXT416((uint)(ipoint->y + auVar68._0_4_));
  auVar68 = vroundss_avx(auVar68,auVar68,0xb);
  auVar70._0_8_ = (double)auVar68._0_4_;
  auVar70._8_8_ = auVar68._8_8_;
  auVar68 = vfmadd231sd_fma(auVar70,auVar73,auVar71);
  auVar71._0_4_ = (float)auVar68._0_8_;
  auVar71._4_12_ = auVar68._4_12_;
  auVar68._0_4_ = (int)auVar67._0_4_;
  auVar68._4_4_ = (int)auVar67._4_4_;
  auVar68._8_4_ = (int)auVar67._8_4_;
  auVar68._12_4_ = (int)auVar67._12_4_;
  auVar67 = vcvtdq2ps_avx(auVar68);
  fVar7 = auVar72._0_4_ - auVar67._0_4_;
  fVar8 = auVar71._0_4_ - auVar67._0_4_;
  auVar67 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1400000),0),ZEXT416((uint)fVar82),auVar72);
  auVar68 = vpternlogd_avx512vl(auVar75,auVar67,auVar74,0xf8);
  auVar67 = ZEXT416((uint)(auVar67._0_4_ + auVar68._0_4_));
  auVar67 = vroundss_avx(auVar67,auVar67,0xb);
  auVar68 = ZEXT416((uint)fVar82);
  if (iVar64 < (int)auVar67._0_4_) {
    auVar67 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1400000),0),auVar68,auVar71);
    auVar76._8_4_ = 0x3effffff;
    auVar76._0_8_ = 0x3effffff3effffff;
    auVar76._12_4_ = 0x3effffff;
    auVar77._8_4_ = 0x80000000;
    auVar77._0_8_ = 0x8000000080000000;
    auVar77._12_4_ = 0x80000000;
    auVar69 = vpternlogd_avx512vl(auVar77,auVar67,auVar76,0xea);
    auVar101 = ZEXT1664(auVar69);
    auVar67 = ZEXT416((uint)(auVar67._0_4_ + auVar69._0_4_));
    auVar67 = vroundss_avx(auVar67,auVar67,0xb);
    if (iVar64 < (int)auVar67._0_4_) {
      auVar67 = vfmadd231ss_fma(auVar72,auVar68,ZEXT416(0x41300000));
      auVar78._8_4_ = 0x80000000;
      auVar78._0_8_ = 0x8000000080000000;
      auVar78._12_4_ = 0x80000000;
      auVar69 = vpternlogd_avx512vl(auVar78,auVar67,auVar76,0xea);
      auVar67 = ZEXT416((uint)(auVar67._0_4_ + auVar69._0_4_));
      auVar67 = vroundss_avx(auVar67,auVar67,0xb);
      if ((int)auVar67._0_4_ + iVar64 <= iimage->width) {
        auVar67 = vfmadd231ss_fma(auVar71,auVar68,ZEXT416(0x41300000));
        auVar20._8_4_ = 0x80000000;
        auVar20._0_8_ = 0x8000000080000000;
        auVar20._12_4_ = 0x80000000;
        auVar69 = vpternlogd_avx512vl(auVar76,auVar67,auVar20,0xf8);
        auVar67 = ZEXT416((uint)(auVar67._0_4_ + auVar69._0_4_));
        auVar67 = vroundss_avx(auVar67,auVar67,0xb);
        if ((int)auVar67._0_4_ + iVar64 <= iimage->height) {
          fVar7 = fVar7 + 0.5;
          fVar8 = fVar8 + 0.5;
          pfVar53 = iimage->data;
          iVar1 = iimage->data_width;
          iVar42 = iVar64 * 2;
          pfVar54 = haarResponseY + 0x4d;
          pfVar57 = haarResponseX + 0x4d;
          uVar32 = 0xfffffff4;
          do {
            auVar67._0_4_ = (float)(int)uVar32;
            auVar105 = in_ZMM8._4_12_;
            auVar67._4_12_ = auVar105;
            auVar67 = vfmadd213ss_fma(auVar67,auVar68,ZEXT416((uint)fVar8));
            iVar29 = (int)auVar67._0_4_;
            auVar90._0_4_ = (float)(int)(uVar32 | 1);
            auVar90._4_12_ = auVar105;
            auVar67 = vfmadd213ss_fma(auVar90,auVar68,ZEXT416((uint)fVar8));
            iVar30 = (int)auVar67._0_4_;
            auVar91._0_4_ = (float)(int)(uVar32 | 2);
            auVar91._4_12_ = auVar105;
            auVar67 = vfmadd213ss_fma(auVar91,auVar68,ZEXT416((uint)fVar8));
            iVar35 = (int)auVar67._0_4_;
            auVar92._0_4_ = (float)(int)(uVar32 | 3);
            auVar92._4_12_ = auVar105;
            auVar67 = vfmadd213ss_fma(auVar92,auVar68,ZEXT416((uint)fVar8));
            iVar37 = (int)auVar67._0_4_;
            iVar44 = (iVar29 + -1) * iVar1;
            iVar28 = (iVar29 + -1 + iVar64) * iVar1;
            iVar36 = (iVar29 + -1 + iVar42) * iVar1;
            iVar49 = (iVar30 + -1) * iVar1;
            iVar29 = (iVar30 + -1 + iVar64) * iVar1;
            iVar45 = (iVar30 + -1 + iVar42) * iVar1;
            iVar48 = (iVar35 + -1) * iVar1;
            iVar30 = (iVar35 + -1 + iVar64) * iVar1;
            iVar46 = (iVar35 + -1 + iVar42) * iVar1;
            iVar38 = (iVar37 + -1) * iVar1;
            iVar35 = (iVar37 + -1 + iVar64) * iVar1;
            iVar37 = (iVar37 + -1 + iVar42) * iVar1;
            lVar62 = 0;
            do {
              iVar58 = (int)lVar62;
              auVar93._0_4_ = (float)(iVar58 + -0xc);
              auVar105 = auVar104._4_12_;
              auVar93._4_12_ = auVar105;
              auVar67 = vfmadd213ss_fma(auVar93,auVar68,ZEXT416((uint)fVar7));
              iVar59 = (int)auVar67._0_4_;
              auVar94._0_4_ = (float)(iVar58 + -0xb);
              auVar94._4_12_ = auVar105;
              auVar67 = vfmadd213ss_fma(auVar94,auVar68,ZEXT416((uint)fVar7));
              iVar50 = (int)auVar67._0_4_;
              auVar95._0_4_ = (float)(iVar58 + -10);
              auVar95._4_12_ = auVar105;
              auVar70 = ZEXT416((uint)fVar7);
              auVar67 = vfmadd213ss_fma(auVar95,auVar68,auVar70);
              iVar47 = (int)auVar67._0_4_;
              auVar100._0_4_ = (float)(iVar58 + -9);
              auVar100._4_12_ = auVar105;
              auVar67 = vfmadd213ss_fma(auVar100,auVar68,auVar70);
              auVar99._0_4_ = (float)(iVar58 + -8);
              auVar99._4_12_ = auVar105;
              auVar96._0_4_ = (float)(iVar58 + -7);
              auVar96._4_12_ = auVar105;
              iVar39 = iVar59 + -1 + iVar64;
              iVar31 = iVar59 + -1 + iVar42;
              fVar82 = pfVar53[iVar28 + -1 + iVar59];
              fVar81 = pfVar53[iVar36 + -1 + iVar59];
              fVar9 = pfVar53[iVar36 + iVar31];
              fVar10 = pfVar53[iVar44 + -1 + iVar59];
              fVar11 = pfVar53[iVar44 + iVar31];
              auVar71 = SUB6416(ZEXT464(0x40000000),0);
              auVar69 = vfmadd213ss_fma(ZEXT416((uint)(pfVar53[iVar44 + iVar39] -
                                                      pfVar53[iVar36 + iVar39])),auVar71,
                                        ZEXT416((uint)(fVar9 - fVar10)));
              fVar87 = pfVar53[iVar28 + iVar31];
              pfVar57[lVar62 + -0x4d] = (fVar81 - fVar11) + auVar69._0_4_;
              auVar69 = vfmadd213ss_fma(ZEXT416((uint)(fVar82 - fVar87)),auVar71,
                                        ZEXT416((uint)(fVar9 - fVar10)));
              pfVar54[lVar62 + -0x4d] = auVar69._0_4_ - (fVar81 - fVar11);
              fVar82 = pfVar53[iVar29 + -1 + iVar59];
              fVar81 = pfVar53[iVar45 + -1 + iVar59];
              fVar9 = pfVar53[iVar45 + iVar31];
              fVar10 = pfVar53[iVar49 + -1 + iVar59];
              fVar11 = pfVar53[iVar49 + iVar31];
              auVar69 = vfmadd213ss_fma(ZEXT416((uint)(pfVar53[iVar49 + iVar39] -
                                                      pfVar53[iVar45 + iVar39])),auVar71,
                                        ZEXT416((uint)(fVar9 - fVar10)));
              fVar87 = pfVar53[iVar29 + iVar31];
              pfVar57[lVar62 + -0x35] = (fVar81 - fVar11) + auVar69._0_4_;
              auVar69 = vfmadd213ss_fma(ZEXT416((uint)(fVar82 - fVar87)),auVar71,
                                        ZEXT416((uint)(fVar9 - fVar10)));
              pfVar54[lVar62 + -0x35] = auVar69._0_4_ - (fVar81 - fVar11);
              fVar82 = pfVar53[iVar30 + -1 + iVar59];
              fVar81 = pfVar53[iVar46 + -1 + iVar59];
              fVar9 = pfVar53[iVar46 + iVar31];
              fVar10 = pfVar53[iVar48 + -1 + iVar59];
              fVar11 = pfVar53[iVar48 + iVar31];
              auVar69 = vfmadd213ss_fma(ZEXT416((uint)(pfVar53[iVar48 + iVar39] -
                                                      pfVar53[iVar46 + iVar39])),auVar71,
                                        ZEXT416((uint)(fVar9 - fVar10)));
              fVar87 = pfVar53[iVar30 + iVar31];
              pfVar57[lVar62 + -0x1d] = (fVar81 - fVar11) + auVar69._0_4_;
              auVar69 = vfmadd213ss_fma(ZEXT416((uint)(fVar82 - fVar87)),auVar71,
                                        ZEXT416((uint)(fVar9 - fVar10)));
              pfVar54[lVar62 + -0x1d] = auVar69._0_4_ - (fVar81 - fVar11);
              fVar82 = pfVar53[iVar35 + -1 + iVar59];
              fVar81 = pfVar53[iVar37 + -1 + iVar59];
              fVar9 = pfVar53[iVar31 + iVar37];
              iVar33 = (int)auVar67._0_4_;
              fVar10 = pfVar53[iVar38 + -1 + iVar59];
              fVar11 = pfVar53[iVar38 + iVar31];
              auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar53[iVar38 + iVar39] -
                                                      pfVar53[iVar39 + iVar37])),auVar71,
                                        ZEXT416((uint)(fVar9 - fVar10)));
              fVar87 = pfVar53[iVar35 + iVar31];
              pfVar57[lVar62 + -5] = (fVar81 - fVar11) + auVar67._0_4_;
              auVar67 = vfmadd213ss_fma(ZEXT416((uint)(fVar82 - fVar87)),auVar71,
                                        ZEXT416((uint)(fVar9 - fVar10)));
              pfVar54[lVar62 + -5] = auVar67._0_4_ - (fVar81 - fVar11);
              iVar31 = iVar50 + -1 + iVar64;
              iVar39 = iVar50 + -1 + iVar42;
              fVar82 = pfVar53[iVar28 + -1 + iVar50];
              fVar81 = pfVar53[iVar36 + -1 + iVar50];
              fVar9 = pfVar53[iVar36 + iVar39];
              fVar10 = pfVar53[iVar44 + -1 + iVar50];
              fVar11 = pfVar53[iVar44 + iVar39];
              auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar53[iVar44 + iVar31] -
                                                      pfVar53[iVar36 + iVar31])),auVar71,
                                        ZEXT416((uint)(fVar9 - fVar10)));
              fVar87 = pfVar53[iVar28 + iVar39];
              pfVar57[lVar62 + -0x4c] = (fVar81 - fVar11) + auVar67._0_4_;
              auVar67 = vfmadd213ss_fma(ZEXT416((uint)(fVar82 - fVar87)),auVar71,
                                        ZEXT416((uint)(fVar9 - fVar10)));
              pfVar54[lVar62 + -0x4c] = auVar67._0_4_ - (fVar81 - fVar11);
              fVar82 = pfVar53[iVar29 + -1 + iVar50];
              fVar81 = pfVar53[iVar45 + -1 + iVar50];
              fVar9 = pfVar53[iVar45 + iVar39];
              fVar10 = pfVar53[iVar49 + -1 + iVar50];
              fVar11 = pfVar53[iVar49 + iVar39];
              auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar53[iVar49 + iVar31] -
                                                      pfVar53[iVar45 + iVar31])),auVar71,
                                        ZEXT416((uint)(fVar9 - fVar10)));
              fVar87 = pfVar53[iVar29 + iVar39];
              pfVar57[lVar62 + -0x34] = (fVar81 - fVar11) + auVar67._0_4_;
              auVar67 = vfmadd213ss_fma(ZEXT416((uint)(fVar82 - fVar87)),auVar71,
                                        ZEXT416((uint)(fVar9 - fVar10)));
              pfVar54[lVar62 + -0x34] = auVar67._0_4_ - (fVar81 - fVar11);
              fVar82 = pfVar53[iVar30 + -1 + iVar50];
              fVar81 = pfVar53[iVar46 + -1 + iVar50];
              fVar9 = pfVar53[iVar46 + iVar39];
              fVar10 = pfVar53[iVar48 + -1 + iVar50];
              fVar11 = pfVar53[iVar48 + iVar39];
              auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar53[iVar48 + iVar31] -
                                                      pfVar53[iVar46 + iVar31])),auVar71,
                                        ZEXT416((uint)(fVar9 - fVar10)));
              fVar87 = pfVar53[iVar30 + iVar39];
              pfVar57[lVar62 + -0x1c] = (fVar81 - fVar11) + auVar67._0_4_;
              auVar67 = vfmadd213ss_fma(ZEXT416((uint)(fVar82 - fVar87)),auVar71,
                                        ZEXT416((uint)(fVar9 - fVar10)));
              pfVar54[lVar62 + -0x1c] = auVar67._0_4_ - (fVar81 - fVar11);
              fVar82 = pfVar53[iVar35 + -1 + iVar50];
              fVar81 = pfVar53[iVar37 + -1 + iVar50];
              fVar9 = pfVar53[iVar39 + iVar37];
              auVar67 = vfmadd213ss_fma(auVar99,auVar68,auVar70);
              fVar10 = pfVar53[iVar38 + -1 + iVar50];
              fVar11 = pfVar53[iVar38 + iVar39];
              auVar69 = vfmadd213ss_fma(ZEXT416((uint)(pfVar53[iVar38 + iVar31] -
                                                      pfVar53[iVar31 + iVar37])),auVar71,
                                        ZEXT416((uint)(fVar9 - fVar10)));
              fVar87 = pfVar53[iVar35 + iVar39];
              pfVar57[lVar62 + -4] = (fVar81 - fVar11) + auVar69._0_4_;
              auVar69 = vfmadd213ss_fma(ZEXT416((uint)(fVar82 - fVar87)),auVar71,
                                        ZEXT416((uint)(fVar9 - fVar10)));
              iVar39 = iVar47 + -1 + iVar64;
              iVar31 = iVar47 + -1 + iVar42;
              pfVar54[lVar62 + -4] = auVar69._0_4_ - (fVar81 - fVar11);
              fVar82 = pfVar53[iVar28 + -1 + iVar47];
              fVar81 = pfVar53[iVar36 + -1 + iVar47];
              fVar9 = pfVar53[iVar36 + iVar31];
              fVar10 = pfVar53[iVar44 + -1 + iVar47];
              fVar11 = pfVar53[iVar44 + iVar31];
              auVar69 = vfmadd213ss_fma(ZEXT416((uint)(pfVar53[iVar44 + iVar39] -
                                                      pfVar53[iVar36 + iVar39])),auVar71,
                                        ZEXT416((uint)(fVar9 - fVar10)));
              fVar87 = pfVar53[iVar28 + iVar31];
              pfVar57[lVar62 + -0x4b] = (fVar81 - fVar11) + auVar69._0_4_;
              auVar69 = vfmadd213ss_fma(ZEXT416((uint)(fVar82 - fVar87)),auVar71,
                                        ZEXT416((uint)(fVar9 - fVar10)));
              pfVar54[lVar62 + -0x4b] = auVar69._0_4_ - (fVar81 - fVar11);
              fVar82 = pfVar53[iVar29 + -1 + iVar47];
              fVar81 = pfVar53[iVar45 + -1 + iVar47];
              fVar9 = pfVar53[iVar45 + iVar31];
              fVar10 = pfVar53[iVar49 + -1 + iVar47];
              fVar11 = pfVar53[iVar49 + iVar31];
              auVar69 = vfmadd213ss_fma(ZEXT416((uint)(pfVar53[iVar49 + iVar39] -
                                                      pfVar53[iVar45 + iVar39])),auVar71,
                                        ZEXT416((uint)(fVar9 - fVar10)));
              fVar87 = pfVar53[iVar29 + iVar31];
              pfVar57[lVar62 + -0x33] = (fVar81 - fVar11) + auVar69._0_4_;
              auVar69 = vfmadd213ss_fma(ZEXT416((uint)(fVar82 - fVar87)),auVar71,
                                        ZEXT416((uint)(fVar9 - fVar10)));
              pfVar54[lVar62 + -0x33] = auVar69._0_4_ - (fVar81 - fVar11);
              fVar82 = pfVar53[iVar30 + -1 + iVar47];
              fVar81 = pfVar53[iVar46 + -1 + iVar47];
              fVar9 = pfVar53[iVar46 + iVar31];
              fVar10 = pfVar53[iVar48 + -1 + iVar47];
              fVar11 = pfVar53[iVar48 + iVar31];
              auVar69 = vfmadd213ss_fma(ZEXT416((uint)(pfVar53[iVar48 + iVar39] -
                                                      pfVar53[iVar46 + iVar39])),auVar71,
                                        ZEXT416((uint)(fVar9 - fVar10)));
              fVar87 = pfVar53[iVar30 + iVar31];
              pfVar57[lVar62 + -0x1b] = (fVar81 - fVar11) + auVar69._0_4_;
              auVar69 = vfmadd213ss_fma(ZEXT416((uint)(fVar82 - fVar87)),auVar71,
                                        ZEXT416((uint)(fVar9 - fVar10)));
              pfVar54[lVar62 + -0x1b] = auVar69._0_4_ - (fVar81 - fVar11);
              fVar82 = pfVar53[iVar35 + -1 + iVar47];
              fVar81 = pfVar53[iVar37 + -1 + iVar47];
              in_ZMM8 = ZEXT464((uint)pfVar53[iVar31 + iVar37]);
              iVar50 = (int)auVar67._0_4_;
              auVar67 = vfmadd213ss_fma(auVar96,auVar68,auVar70);
              fVar9 = pfVar53[iVar38 + iVar31];
              auVar70 = ZEXT416((uint)(pfVar53[iVar31 + iVar37] - pfVar53[iVar38 + -1 + iVar47]));
              auVar69 = vfmadd213ss_fma(ZEXT416((uint)(pfVar53[iVar38 + iVar39] -
                                                      pfVar53[iVar39 + iVar37])),auVar71,auVar70);
              fVar10 = pfVar53[iVar35 + iVar31];
              pfVar57[lVar62 + -3] = (fVar81 - fVar9) + auVar69._0_4_;
              auVar69 = vfmadd213ss_fma(ZEXT416((uint)(fVar82 - fVar10)),auVar71,auVar70);
              pfVar54[lVar62 + -3] = auVar69._0_4_ - (fVar81 - fVar9);
              iVar31 = iVar33 + -1 + iVar64;
              iVar47 = iVar33 + -1 + iVar42;
              fVar82 = pfVar53[iVar28 + -1 + iVar33];
              fVar81 = pfVar53[iVar36 + -1 + iVar33];
              fVar9 = pfVar53[iVar36 + iVar47];
              fVar10 = pfVar53[iVar44 + -1 + iVar33];
              fVar11 = pfVar53[iVar44 + iVar47];
              auVar69 = vfmadd213ss_fma(ZEXT416((uint)(pfVar53[iVar44 + iVar31] -
                                                      pfVar53[iVar36 + iVar31])),auVar71,
                                        ZEXT416((uint)(fVar9 - fVar10)));
              fVar87 = pfVar53[iVar28 + iVar47];
              pfVar57[lVar62 + -0x4a] = (fVar81 - fVar11) + auVar69._0_4_;
              auVar69 = vfmadd213ss_fma(ZEXT416((uint)(fVar82 - fVar87)),auVar71,
                                        ZEXT416((uint)(fVar9 - fVar10)));
              pfVar54[lVar62 + -0x4a] = auVar69._0_4_ - (fVar81 - fVar11);
              fVar82 = pfVar53[iVar29 + -1 + iVar33];
              fVar81 = pfVar53[iVar45 + -1 + iVar33];
              fVar9 = pfVar53[iVar45 + iVar47];
              fVar10 = pfVar53[iVar49 + -1 + iVar33];
              fVar11 = pfVar53[iVar49 + iVar47];
              auVar69 = vfmadd213ss_fma(ZEXT416((uint)(pfVar53[iVar49 + iVar31] -
                                                      pfVar53[iVar45 + iVar31])),auVar71,
                                        ZEXT416((uint)(fVar9 - fVar10)));
              fVar87 = pfVar53[iVar29 + iVar47];
              pfVar57[lVar62 + -0x32] = (fVar81 - fVar11) + auVar69._0_4_;
              auVar69 = vfmadd213ss_fma(ZEXT416((uint)(fVar82 - fVar87)),auVar71,
                                        ZEXT416((uint)(fVar9 - fVar10)));
              pfVar54[lVar62 + -0x32] = auVar69._0_4_ - (fVar81 - fVar11);
              fVar82 = pfVar53[iVar30 + -1 + iVar33];
              fVar81 = pfVar53[iVar46 + -1 + iVar33];
              fVar9 = pfVar53[iVar46 + iVar47];
              fVar10 = pfVar53[iVar48 + -1 + iVar33];
              fVar11 = pfVar53[iVar48 + iVar47];
              auVar69 = vfmadd213ss_fma(ZEXT416((uint)(pfVar53[iVar48 + iVar31] -
                                                      pfVar53[iVar46 + iVar31])),auVar71,
                                        ZEXT416((uint)(fVar9 - fVar10)));
              fVar87 = pfVar53[iVar30 + iVar47];
              pfVar57[lVar62 + -0x1a] = (fVar81 - fVar11) + auVar69._0_4_;
              auVar69 = vfmadd213ss_fma(ZEXT416((uint)(fVar82 - fVar87)),auVar71,
                                        ZEXT416((uint)(fVar9 - fVar10)));
              pfVar54[lVar62 + -0x1a] = auVar69._0_4_ - (fVar81 - fVar11);
              fVar82 = pfVar53[iVar35 + -1 + iVar33];
              fVar81 = pfVar53[iVar37 + -1 + iVar33];
              auVar104 = ZEXT464((uint)pfVar53[iVar47 + iVar37]);
              iVar39 = (int)auVar67._0_4_;
              fVar9 = pfVar53[iVar38 + iVar47];
              auVar69 = ZEXT416((uint)(pfVar53[iVar47 + iVar37] - pfVar53[iVar38 + -1 + iVar33]));
              auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar53[iVar38 + iVar31] -
                                                      pfVar53[iVar31 + iVar37])),auVar71,auVar69);
              fVar10 = pfVar53[iVar35 + iVar47];
              pfVar57[lVar62 + -2] = (fVar81 - fVar9) + auVar67._0_4_;
              auVar67 = vfmadd213ss_fma(ZEXT416((uint)(fVar82 - fVar10)),auVar71,auVar69);
              pfVar54[lVar62 + -2] = auVar67._0_4_ - (fVar81 - fVar9);
              iVar31 = iVar50 + -1 + iVar64;
              iVar33 = iVar50 + -1 + iVar42;
              fVar82 = pfVar53[iVar28 + -1 + iVar50];
              fVar81 = pfVar53[iVar36 + -1 + iVar50];
              fVar9 = pfVar53[iVar36 + iVar33];
              fVar10 = pfVar53[iVar44 + -1 + iVar50];
              fVar11 = pfVar53[iVar44 + iVar33];
              auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar53[iVar44 + iVar31] -
                                                      pfVar53[iVar36 + iVar31])),auVar71,
                                        ZEXT416((uint)(fVar9 - fVar10)));
              fVar87 = pfVar53[iVar28 + iVar33];
              pfVar57[lVar62 + -0x49] = (fVar81 - fVar11) + auVar67._0_4_;
              auVar67 = vfmadd213ss_fma(ZEXT416((uint)(fVar82 - fVar87)),auVar71,
                                        ZEXT416((uint)(fVar9 - fVar10)));
              pfVar54[lVar62 + -0x49] = auVar67._0_4_ - (fVar81 - fVar11);
              fVar82 = pfVar53[iVar29 + -1 + iVar50];
              fVar81 = pfVar53[iVar45 + -1 + iVar50];
              fVar9 = pfVar53[iVar45 + iVar33];
              fVar10 = pfVar53[iVar49 + -1 + iVar50];
              fVar11 = pfVar53[iVar49 + iVar33];
              auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar53[iVar49 + iVar31] -
                                                      pfVar53[iVar45 + iVar31])),auVar71,
                                        ZEXT416((uint)(fVar9 - fVar10)));
              fVar87 = pfVar53[iVar29 + iVar33];
              pfVar57[lVar62 + -0x31] = (fVar81 - fVar11) + auVar67._0_4_;
              auVar67 = vfmadd213ss_fma(ZEXT416((uint)(fVar82 - fVar87)),auVar71,
                                        ZEXT416((uint)(fVar9 - fVar10)));
              pfVar54[lVar62 + -0x31] = auVar67._0_4_ - (fVar81 - fVar11);
              fVar82 = pfVar53[iVar30 + -1 + iVar50];
              fVar81 = pfVar53[iVar46 + -1 + iVar50];
              fVar9 = pfVar53[iVar46 + iVar33];
              fVar10 = pfVar53[iVar48 + -1 + iVar50];
              fVar11 = pfVar53[iVar48 + iVar33];
              auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar53[iVar48 + iVar31] -
                                                      pfVar53[iVar46 + iVar31])),auVar71,
                                        ZEXT416((uint)(fVar9 - fVar10)));
              fVar87 = pfVar53[iVar30 + iVar33];
              pfVar57[lVar62 + -0x19] = (fVar81 - fVar11) + auVar67._0_4_;
              auVar67 = vfmadd213ss_fma(ZEXT416((uint)(fVar82 - fVar87)),auVar71,
                                        ZEXT416((uint)(fVar9 - fVar10)));
              pfVar54[lVar62 + -0x19] = auVar67._0_4_ - (fVar81 - fVar11);
              fVar82 = pfVar53[iVar35 + -1 + iVar50];
              fVar81 = pfVar53[iVar37 + -1 + iVar50];
              fVar9 = pfVar53[iVar33 + iVar37];
              fVar10 = pfVar53[iVar38 + -1 + iVar50];
              fVar11 = pfVar53[iVar38 + iVar33];
              auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar53[iVar38 + iVar31] -
                                                      pfVar53[iVar31 + iVar37])),auVar71,
                                        ZEXT416((uint)(fVar9 - fVar10)));
              fVar87 = pfVar53[iVar35 + iVar33];
              pfVar57[lVar62 + -1] = (fVar81 - fVar11) + auVar67._0_4_;
              auVar67 = vfmadd213ss_fma(ZEXT416((uint)(fVar82 - fVar87)),auVar71,
                                        ZEXT416((uint)(fVar9 - fVar10)));
              pfVar54[lVar62 + -1] = auVar67._0_4_ - (fVar81 - fVar11);
              iVar31 = iVar39 + -1 + iVar64;
              iVar33 = iVar39 + -1 + iVar42;
              fVar82 = pfVar53[iVar28 + -1 + iVar39];
              fVar81 = pfVar53[iVar36 + -1 + iVar39];
              fVar9 = pfVar53[iVar36 + iVar33];
              fVar10 = pfVar53[iVar44 + -1 + iVar39];
              fVar11 = pfVar53[iVar44 + iVar33];
              auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar53[iVar44 + iVar31] -
                                                      pfVar53[iVar36 + iVar31])),auVar71,
                                        ZEXT416((uint)(fVar9 - fVar10)));
              fVar87 = pfVar53[iVar28 + iVar33];
              pfVar57[lVar62 + -0x48] = (fVar81 - fVar11) + auVar67._0_4_;
              auVar67 = vfmadd213ss_fma(ZEXT416((uint)(fVar82 - fVar87)),auVar71,
                                        ZEXT416((uint)(fVar9 - fVar10)));
              pfVar54[lVar62 + -0x48] = auVar67._0_4_ - (fVar81 - fVar11);
              fVar82 = pfVar53[iVar29 + -1 + iVar39];
              fVar81 = pfVar53[iVar45 + -1 + iVar39];
              fVar9 = pfVar53[iVar45 + iVar33];
              fVar10 = pfVar53[iVar49 + -1 + iVar39];
              fVar11 = pfVar53[iVar49 + iVar33];
              auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar53[iVar49 + iVar31] -
                                                      pfVar53[iVar45 + iVar31])),auVar71,
                                        ZEXT416((uint)(fVar9 - fVar10)));
              fVar87 = pfVar53[iVar29 + iVar33];
              pfVar57[lVar62 + -0x30] = (fVar81 - fVar11) + auVar67._0_4_;
              auVar67 = vfmadd213ss_fma(ZEXT416((uint)(fVar82 - fVar87)),auVar71,
                                        ZEXT416((uint)(fVar9 - fVar10)));
              pfVar54[lVar62 + -0x30] = auVar67._0_4_ - (fVar81 - fVar11);
              fVar82 = pfVar53[iVar30 + -1 + iVar39];
              fVar81 = pfVar53[iVar46 + -1 + iVar39];
              fVar9 = pfVar53[iVar46 + iVar33];
              fVar10 = pfVar53[iVar48 + -1 + iVar39];
              fVar11 = pfVar53[iVar48 + iVar33];
              auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar53[iVar48 + iVar31] -
                                                      pfVar53[iVar46 + iVar31])),auVar71,
                                        ZEXT416((uint)(fVar9 - fVar10)));
              fVar87 = pfVar53[iVar30 + iVar33];
              pfVar57[lVar62 + -0x18] = (fVar81 - fVar11) + auVar67._0_4_;
              auVar67 = vfmadd213ss_fma(ZEXT416((uint)(fVar82 - fVar87)),auVar71,
                                        ZEXT416((uint)(fVar9 - fVar10)));
              pfVar54[lVar62 + -0x18] = auVar67._0_4_ - (fVar81 - fVar11);
              fVar82 = pfVar53[iVar35 + -1 + iVar39];
              fVar81 = pfVar53[iVar37 + -1 + iVar39];
              fVar9 = pfVar53[iVar33 + iVar37];
              fVar10 = pfVar53[iVar38 + -1 + iVar39];
              fVar11 = pfVar53[iVar38 + iVar33];
              fVar87 = pfVar53[iVar35 + iVar33];
              auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar53[iVar38 + iVar31] -
                                                      pfVar53[iVar31 + iVar37])),auVar71,
                                        ZEXT416((uint)(fVar9 - fVar10)));
              pfVar57[lVar62] = (fVar81 - fVar11) + auVar67._0_4_;
              auVar67 = vfmadd213ss_fma(ZEXT416((uint)(fVar82 - fVar87)),auVar71,
                                        ZEXT416((uint)(fVar9 - fVar10)));
              pfVar54[lVar62] = auVar67._0_4_ - (fVar81 - fVar11);
              lVar62 = lVar62 + 6;
            } while (iVar58 + -0xc < 6);
            pfVar54 = pfVar54 + 0x60;
            pfVar57 = pfVar57 + 0x60;
            bVar2 = (int)uVar32 < 8;
            uVar32 = uVar32 + 4;
          } while (bVar2);
          goto LAB_00225fc3;
        }
      }
    }
  }
  iVar1 = iVar64 * 2;
  lVar62 = 0;
  uVar32 = 0xfffffff4;
  do {
    auVar67 = vpbroadcastd_avx512vl();
    auVar21._8_4_ = 3;
    auVar21._0_8_ = 0x200000003;
    auVar21._12_4_ = 2;
    auVar67 = vporq_avx512vl(auVar67,auVar21);
    auVar67 = vpinsrd_avx(auVar67,uVar32 | 1,2);
    auVar67 = vpinsrd_avx(auVar67,uVar32,3);
    auVar67 = vcvtdq2ps_avx(auVar67);
    auVar27._4_4_ = fVar8;
    auVar27._0_4_ = fVar8;
    auVar27._8_4_ = fVar8;
    auVar27._12_4_ = fVar8;
    auVar24._4_4_ = fVar82;
    auVar24._0_4_ = fVar82;
    auVar24._8_4_ = fVar82;
    auVar24._12_4_ = fVar82;
    auVar67 = vfmadd132ps_fma(auVar67,auVar27,auVar24);
    auVar6 = vcvtps2pd_avx(auVar67);
    uVar34 = vcmpps_avx512vl(auVar67,_DAT_00576190,0xd);
    auVar85._8_8_ = 0xbfe0000000000000;
    auVar85._0_8_ = 0xbfe0000000000000;
    auVar85._16_8_ = 0xbfe0000000000000;
    auVar85._24_8_ = 0xbfe0000000000000;
    auVar79._12_4_ = 0x3fe00000;
    auVar79._0_12_ = ZEXT812(0x3fe0000000000000);
    auVar79._16_8_ = 0x3fe0000000000000;
    auVar79._24_8_ = 0x3fe0000000000000;
    auVar79 = vblendmpd_avx512vl(auVar85,auVar79);
    bVar2 = (bool)((byte)uVar34 & 1);
    bVar3 = (bool)((byte)(uVar34 >> 1) & 1);
    bVar4 = (bool)((byte)(uVar34 >> 2) & 1);
    bVar5 = (bool)((byte)(uVar34 >> 3) & 1);
    auVar83._0_4_ =
         (int)((double)((ulong)bVar2 * auVar79._0_8_ | (ulong)!bVar2 * -0x4020000000000000) +
              auVar6._0_8_);
    auVar83._4_4_ =
         (int)((double)((ulong)bVar3 * auVar79._8_8_ | (ulong)!bVar3 * -0x4020000000000000) +
              auVar6._8_8_);
    auVar83._8_4_ =
         (int)((double)((ulong)bVar4 * auVar79._16_8_ | (ulong)!bVar4 * -0x4020000000000000) +
              auVar6._16_8_);
    auVar83._12_4_ =
         (int)((double)((ulong)bVar5 * auVar79._24_8_ | (ulong)!bVar5 * -0x4020000000000000) +
              auVar6._24_8_);
    iVar29 = iVar1 + auVar83._12_4_;
    iVar30 = auVar83._12_4_ + -1 + iVar64;
    iVar35 = auVar83._12_4_ + -1;
    iVar36 = iVar1 + auVar83._8_4_;
    iVar37 = auVar83._8_4_ + -1 + iVar64;
    iVar38 = auVar83._8_4_ + -1;
    iVar44 = iVar1 + auVar83._4_4_;
    iVar45 = auVar83._4_4_ + -1 + iVar64;
    auVar22._8_4_ = 1;
    auVar22._0_8_ = 0x100000001;
    auVar22._12_4_ = 1;
    uVar34 = vpcmpd_avx512vl(auVar83,auVar22,1);
    uVar65 = uVar34 & 0xf;
    uVar43 = uVar65 >> 1;
    uVar40 = uVar65 >> 2;
    uVar65 = uVar65 >> 3;
    iVar46 = auVar83._4_4_ + -1;
    iVar48 = iVar1 + auVar83._0_4_;
    iVar49 = auVar83._0_4_ + -1 + iVar64;
    iVar28 = auVar83._0_4_ + -1;
    lVar61 = lVar62;
    iVar42 = -0xc;
    do {
      auVar84._0_4_ = (float)iVar42;
      auVar84._4_12_ = auVar102._4_12_;
      auVar67 = vfmadd213ss_fma(auVar84,auVar108._0_16_,ZEXT416((uint)fVar7));
      auVar97._0_4_ = (float)(iVar42 + 1);
      auVar97._4_12_ = auVar101._4_12_;
      auVar69 = vfmadd213ss_fma(auVar97,auVar108._0_16_,ZEXT416((uint)fVar7));
      fVar81 = auVar67._0_4_;
      iVar58 = (int)((double)((ulong)(0.0 <= fVar81) * 0x3fe0000000000000 +
                             (ulong)(0.0 > fVar81) * -0x4020000000000000) + (double)fVar81);
      fVar81 = auVar69._0_4_;
      pfVar53 = (float *)((long)haarResponseY + lVar61);
      if (((iVar58 < 1 || uVar65 != 0) || (iimage->height < iVar29)) ||
         (iVar31 = iVar1 + iVar58, iimage->width < iVar31)) {
        auVar101 = ZEXT1664(auVar101._0_16_);
        auVar102 = ZEXT1664(auVar102._0_16_);
        haarXY(iimage,auVar83._12_4_,iVar58,iVar64,(float *)((long)haarResponseX + lVar61),pfVar53);
      }
      else {
        iVar47 = iVar58 + -1 + iVar64;
        pfVar54 = iimage->data;
        iVar33 = iimage->data_width;
        iVar39 = iVar33 * iVar35;
        fVar9 = pfVar54[iVar33 * iVar30 + -1 + iVar58];
        iVar50 = iVar33 * (iVar1 + -1 + auVar83._12_4_);
        fVar10 = pfVar54[iVar50 + -1 + iVar58];
        fVar11 = pfVar54[iVar50 + -1 + iVar31];
        fVar87 = pfVar54[iVar39 + -1 + iVar58];
        fVar12 = pfVar54[iVar39 + -1 + iVar31];
        fVar13 = pfVar54[iVar33 * iVar30 + -1 + iVar31];
        auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar54[iVar39 + iVar47] - pfVar54[iVar50 + iVar47]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar11 - fVar87)));
        *(float *)((long)haarResponseX + lVar61) = (fVar10 - fVar12) + auVar67._0_4_;
        auVar67 = vfmadd213ss_fma(ZEXT416((uint)(fVar9 - fVar13)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar11 - fVar87)));
        *pfVar53 = auVar67._0_4_ - (fVar10 - fVar12);
      }
      pfVar53 = (float *)((long)haarResponseX + lVar61 + 0x60);
      pfVar54 = (float *)((long)haarResponseY + lVar61 + 0x60);
      if (((iVar58 < 1 || (uVar40 & 1) != 0) || (iimage->height < iVar36)) ||
         (iVar31 = iVar1 + iVar58, iimage->width < iVar31)) {
        auVar101 = ZEXT1664(auVar101._0_16_);
        auVar102 = ZEXT1664(auVar102._0_16_);
        haarXY(iimage,auVar83._8_4_,iVar58,iVar64,pfVar53,pfVar54);
      }
      else {
        iVar47 = iVar58 + -1 + iVar64;
        pfVar57 = iimage->data;
        iVar33 = iimage->data_width;
        iVar39 = iVar33 * iVar38;
        fVar9 = pfVar57[iVar33 * iVar37 + -1 + iVar58];
        iVar50 = iVar33 * (iVar1 + -1 + auVar83._8_4_);
        fVar10 = pfVar57[iVar50 + -1 + iVar58];
        fVar11 = pfVar57[iVar50 + -1 + iVar31];
        fVar87 = pfVar57[iVar39 + -1 + iVar58];
        fVar12 = pfVar57[iVar39 + -1 + iVar31];
        fVar13 = pfVar57[iVar33 * iVar37 + -1 + iVar31];
        auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar57[iVar39 + iVar47] - pfVar57[iVar50 + iVar47]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar11 - fVar87)));
        *pfVar53 = (fVar10 - fVar12) + auVar67._0_4_;
        auVar67 = vfmadd213ss_fma(ZEXT416((uint)(fVar9 - fVar13)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar11 - fVar87)));
        *pfVar54 = auVar67._0_4_ - (fVar10 - fVar12);
      }
      pfVar53 = (float *)((long)haarResponseX + lVar61 + 0xc0);
      pfVar54 = (float *)((long)haarResponseY + lVar61 + 0xc0);
      if (((iVar58 < 1 || (uVar43 & 1) != 0) || (iimage->height < iVar44)) ||
         (iVar31 = iVar1 + iVar58, iimage->width < iVar31)) {
        auVar101 = ZEXT1664(auVar101._0_16_);
        auVar102 = ZEXT1664(auVar102._0_16_);
        haarXY(iimage,auVar83._4_4_,iVar58,iVar64,pfVar53,pfVar54);
      }
      else {
        iVar47 = iVar58 + -1 + iVar64;
        pfVar57 = iimage->data;
        iVar33 = iimage->data_width;
        iVar39 = iVar33 * iVar46;
        fVar9 = pfVar57[iVar33 * iVar45 + -1 + iVar58];
        iVar50 = iVar33 * (iVar1 + -1 + auVar83._4_4_);
        fVar10 = pfVar57[iVar50 + -1 + iVar58];
        fVar11 = pfVar57[iVar50 + -1 + iVar31];
        fVar87 = pfVar57[iVar39 + -1 + iVar58];
        fVar12 = pfVar57[iVar39 + -1 + iVar31];
        fVar13 = pfVar57[iVar33 * iVar45 + -1 + iVar31];
        auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar57[iVar39 + iVar47] - pfVar57[iVar50 + iVar47]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar11 - fVar87)));
        *pfVar53 = (fVar10 - fVar12) + auVar67._0_4_;
        auVar67 = vfmadd213ss_fma(ZEXT416((uint)(fVar9 - fVar13)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar11 - fVar87)));
        *pfVar54 = auVar67._0_4_ - (fVar10 - fVar12);
      }
      pfVar53 = (float *)((long)haarResponseX + lVar61 + 0x120);
      pfVar54 = (float *)((long)haarResponseY + lVar61 + 0x120);
      if (((iVar58 < 1 || (uVar34 & 1) != 0) || (iimage->height < iVar48)) ||
         (iVar31 = iVar1 + iVar58, iimage->width < iVar31)) {
        auVar101 = ZEXT1664(auVar101._0_16_);
        auVar102 = ZEXT1664(auVar102._0_16_);
        haarXY(iimage,auVar83._0_4_,iVar58,iVar64,pfVar53,pfVar54);
      }
      else {
        iVar39 = iVar58 + -1 + iVar64;
        pfVar57 = iimage->data;
        iVar33 = iimage->data_width;
        iVar50 = iVar33 * iVar28;
        fVar9 = pfVar57[iVar33 * iVar49 + -1 + iVar58];
        iVar47 = iVar33 * (iVar1 + -1 + auVar83._0_4_);
        fVar10 = pfVar57[iVar47 + -1 + iVar58];
        fVar11 = pfVar57[iVar47 + -1 + iVar31];
        fVar87 = pfVar57[iVar50 + -1 + iVar58];
        fVar12 = pfVar57[iVar50 + -1 + iVar31];
        fVar13 = pfVar57[iVar33 * iVar49 + -1 + iVar31];
        auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar57[iVar50 + iVar39] - pfVar57[iVar47 + iVar39]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar11 - fVar87)));
        *pfVar53 = (fVar10 - fVar12) + auVar67._0_4_;
        auVar67 = vfmadd213ss_fma(ZEXT416((uint)(fVar9 - fVar13)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar11 - fVar87)));
        *pfVar54 = auVar67._0_4_ - (fVar10 - fVar12);
      }
      iVar58 = (int)((double)((ulong)(0.0 <= fVar81) * 0x3fe0000000000000 +
                             (ulong)(0.0 > fVar81) * -0x4020000000000000) + (double)fVar81);
      pfVar53 = (float *)((long)haarResponseX + lVar61 + 4);
      pfVar54 = (float *)((long)haarResponseY + lVar61 + 4);
      if (((iVar58 < 1 || uVar65 != 0) || (iimage->height < iVar29)) ||
         (iVar31 = iVar1 + iVar58, iimage->width < iVar31)) {
        auVar101 = ZEXT1664(auVar101._0_16_);
        auVar102 = ZEXT1664(auVar102._0_16_);
        haarXY(iimage,auVar83._12_4_,iVar58,iVar64,pfVar53,pfVar54);
      }
      else {
        iVar47 = iVar58 + -1 + iVar64;
        pfVar57 = iimage->data;
        iVar33 = iimage->data_width;
        iVar39 = iVar33 * iVar35;
        fVar81 = pfVar57[iVar33 * iVar30 + -1 + iVar58];
        iVar50 = iVar33 * (iVar1 + -1 + auVar83._12_4_);
        fVar9 = pfVar57[iVar50 + -1 + iVar58];
        fVar10 = pfVar57[iVar50 + -1 + iVar31];
        fVar11 = pfVar57[iVar39 + -1 + iVar58];
        fVar87 = pfVar57[iVar39 + -1 + iVar31];
        fVar12 = pfVar57[iVar33 * iVar30 + -1 + iVar31];
        auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar57[iVar39 + iVar47] - pfVar57[iVar50 + iVar47]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar10 - fVar11)));
        *pfVar53 = (fVar9 - fVar87) + auVar67._0_4_;
        auVar67 = vfmadd213ss_fma(ZEXT416((uint)(fVar81 - fVar12)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar10 - fVar11)));
        *pfVar54 = auVar67._0_4_ - (fVar9 - fVar87);
      }
      pfVar53 = (float *)((long)haarResponseX + lVar61 + 100);
      pfVar54 = (float *)((long)haarResponseY + lVar61 + 100);
      if (((iVar58 < 1 || (uVar40 & 1) != 0) || (iimage->height < iVar36)) ||
         (iVar31 = iVar1 + iVar58, iimage->width < iVar31)) {
        auVar101 = ZEXT1664(auVar101._0_16_);
        auVar102 = ZEXT1664(auVar102._0_16_);
        haarXY(iimage,auVar83._8_4_,iVar58,iVar64,pfVar53,pfVar54);
      }
      else {
        iVar47 = iVar58 + -1 + iVar64;
        pfVar57 = iimage->data;
        iVar33 = iimage->data_width;
        iVar39 = iVar33 * iVar38;
        fVar81 = pfVar57[iVar33 * iVar37 + -1 + iVar58];
        iVar50 = iVar33 * (iVar1 + -1 + auVar83._8_4_);
        fVar9 = pfVar57[iVar50 + -1 + iVar58];
        fVar10 = pfVar57[iVar50 + -1 + iVar31];
        fVar11 = pfVar57[iVar39 + -1 + iVar58];
        fVar87 = pfVar57[iVar39 + -1 + iVar31];
        fVar12 = pfVar57[iVar33 * iVar37 + -1 + iVar31];
        auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar57[iVar39 + iVar47] - pfVar57[iVar50 + iVar47]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar10 - fVar11)));
        *pfVar53 = (fVar9 - fVar87) + auVar67._0_4_;
        auVar67 = vfmadd213ss_fma(ZEXT416((uint)(fVar81 - fVar12)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar10 - fVar11)));
        *pfVar54 = auVar67._0_4_ - (fVar9 - fVar87);
      }
      pfVar53 = (float *)((long)haarResponseX + lVar61 + 0xc4);
      pfVar54 = (float *)((long)haarResponseY + lVar61 + 0xc4);
      if (((iVar58 < 1 || (uVar43 & 1) != 0) || (iimage->height < iVar44)) ||
         (iVar31 = iVar1 + iVar58, iimage->width < iVar31)) {
        auVar101 = ZEXT1664(auVar101._0_16_);
        auVar102 = ZEXT1664(auVar102._0_16_);
        haarXY(iimage,auVar83._4_4_,iVar58,iVar64,pfVar53,pfVar54);
      }
      else {
        iVar47 = iVar58 + -1 + iVar64;
        pfVar57 = iimage->data;
        iVar33 = iimage->data_width;
        iVar39 = iVar33 * iVar46;
        fVar81 = pfVar57[iVar33 * iVar45 + -1 + iVar58];
        iVar50 = iVar33 * (iVar1 + -1 + auVar83._4_4_);
        fVar9 = pfVar57[iVar50 + -1 + iVar58];
        fVar10 = pfVar57[iVar50 + -1 + iVar31];
        fVar11 = pfVar57[iVar39 + -1 + iVar58];
        fVar87 = pfVar57[iVar39 + -1 + iVar31];
        fVar12 = pfVar57[iVar33 * iVar45 + -1 + iVar31];
        auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar57[iVar39 + iVar47] - pfVar57[iVar50 + iVar47]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar10 - fVar11)));
        *pfVar53 = (fVar9 - fVar87) + auVar67._0_4_;
        auVar67 = vfmadd213ss_fma(ZEXT416((uint)(fVar81 - fVar12)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar10 - fVar11)));
        *pfVar54 = auVar67._0_4_ - (fVar9 - fVar87);
      }
      pfVar53 = (float *)((long)haarResponseX + lVar61 + 0x124);
      pfVar54 = (float *)((long)haarResponseY + lVar61 + 0x124);
      if (((iVar58 < 1 || (uVar34 & 1) != 0) || (iimage->height < iVar48)) ||
         (iVar31 = iVar1 + iVar58, iimage->width < iVar31)) {
        auVar101 = ZEXT1664(auVar101._0_16_);
        auVar102 = ZEXT1664(auVar102._0_16_);
        haarXY(iimage,auVar83._0_4_,iVar58,iVar64,pfVar53,pfVar54);
      }
      else {
        iVar39 = iVar58 + -1 + iVar64;
        pfVar57 = iimage->data;
        iVar33 = iimage->data_width;
        iVar50 = iVar33 * iVar28;
        fVar81 = pfVar57[iVar33 * iVar49 + -1 + iVar58];
        iVar47 = iVar33 * (iVar1 + -1 + auVar83._0_4_);
        fVar9 = pfVar57[iVar47 + -1 + iVar58];
        fVar10 = pfVar57[iVar47 + -1 + iVar31];
        fVar11 = pfVar57[iVar50 + -1 + iVar58];
        fVar87 = pfVar57[iVar50 + -1 + iVar31];
        fVar12 = pfVar57[iVar33 * iVar49 + -1 + iVar31];
        auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar57[iVar50 + iVar39] - pfVar57[iVar47 + iVar39]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar10 - fVar11)));
        *pfVar53 = (fVar9 - fVar87) + auVar67._0_4_;
        auVar67 = vfmadd213ss_fma(ZEXT416((uint)(fVar81 - fVar12)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar10 - fVar11)));
        *pfVar54 = auVar67._0_4_ - (fVar9 - fVar87);
      }
      auVar67 = vpbroadcastd_avx512vl();
      auVar67 = vpaddd_avx(auVar67,_DAT_005766e0);
      auVar67 = vcvtdq2ps_avx(auVar67);
      auVar26._4_4_ = fVar7;
      auVar26._0_4_ = fVar7;
      auVar26._8_4_ = fVar7;
      auVar26._12_4_ = fVar7;
      auVar25._4_4_ = fVar82;
      auVar25._0_4_ = fVar82;
      auVar25._8_4_ = fVar82;
      auVar25._12_4_ = fVar82;
      auVar69 = vfmadd132ps_fma(auVar67,auVar26,auVar25);
      auVar67 = vshufps_avx(auVar69,auVar69,0xff);
      uVar19 = vcmpps_avx512vl(auVar69,_DAT_00576190,0xd);
      bVar66 = (byte)(uVar19 >> 3);
      iVar58 = (int)((double)((ulong)(bVar66 & 1) * 0x3fe0000000000000 +
                             (ulong)!(bool)(bVar66 & 1) * -0x4020000000000000) +
                    (double)auVar67._0_4_);
      pfVar53 = (float *)((long)haarResponseX + lVar61 + 8);
      pfVar54 = (float *)((long)haarResponseY + lVar61 + 8);
      if (((iVar58 < 1 || uVar65 != 0) || (iimage->height < iVar29)) ||
         (iVar31 = iVar1 + iVar58, iimage->width < iVar31)) {
        auVar101 = ZEXT1664(auVar101._0_16_);
        auVar102 = ZEXT1664(auVar102._0_16_);
        haarXY(iimage,auVar83._12_4_,iVar58,iVar64,pfVar53,pfVar54);
      }
      else {
        iVar47 = iVar58 + -1 + iVar64;
        pfVar57 = iimage->data;
        iVar33 = iimage->data_width;
        iVar39 = iVar33 * iVar35;
        fVar81 = pfVar57[iVar33 * iVar30 + -1 + iVar58];
        iVar50 = iVar33 * (iVar1 + -1 + auVar83._12_4_);
        fVar9 = pfVar57[iVar50 + -1 + iVar58];
        fVar10 = pfVar57[iVar50 + -1 + iVar31];
        fVar11 = pfVar57[iVar39 + -1 + iVar58];
        fVar87 = pfVar57[iVar39 + -1 + iVar31];
        fVar12 = pfVar57[iVar33 * iVar30 + -1 + iVar31];
        auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar57[iVar39 + iVar47] - pfVar57[iVar50 + iVar47]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar10 - fVar11)));
        *pfVar53 = (fVar9 - fVar87) + auVar67._0_4_;
        auVar67 = vfmadd213ss_fma(ZEXT416((uint)(fVar81 - fVar12)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar10 - fVar11)));
        *pfVar54 = auVar67._0_4_ - (fVar9 - fVar87);
      }
      pfVar53 = (float *)((long)haarResponseX + lVar61 + 0x68);
      pfVar54 = (float *)((long)haarResponseY + lVar61 + 0x68);
      if (((iVar58 < 1 || (uVar40 & 1) != 0) || (iimage->height < iVar36)) ||
         (iVar31 = iVar1 + iVar58, iimage->width < iVar31)) {
        auVar101 = ZEXT1664(auVar101._0_16_);
        auVar102 = ZEXT1664(auVar102._0_16_);
        haarXY(iimage,auVar83._8_4_,iVar58,iVar64,pfVar53,pfVar54);
      }
      else {
        iVar47 = iVar58 + -1 + iVar64;
        pfVar57 = iimage->data;
        iVar33 = iimage->data_width;
        iVar39 = iVar33 * iVar38;
        fVar81 = pfVar57[iVar33 * iVar37 + -1 + iVar58];
        iVar50 = iVar33 * (iVar1 + -1 + auVar83._8_4_);
        fVar9 = pfVar57[iVar50 + -1 + iVar58];
        fVar10 = pfVar57[iVar50 + -1 + iVar31];
        fVar11 = pfVar57[iVar39 + -1 + iVar58];
        fVar87 = pfVar57[iVar39 + -1 + iVar31];
        fVar12 = pfVar57[iVar33 * iVar37 + -1 + iVar31];
        auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar57[iVar39 + iVar47] - pfVar57[iVar50 + iVar47]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar10 - fVar11)));
        *pfVar53 = (fVar9 - fVar87) + auVar67._0_4_;
        auVar67 = vfmadd213ss_fma(ZEXT416((uint)(fVar81 - fVar12)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar10 - fVar11)));
        *pfVar54 = auVar67._0_4_ - (fVar9 - fVar87);
      }
      pfVar53 = (float *)((long)haarResponseX + lVar61 + 200);
      pfVar54 = (float *)((long)haarResponseY + lVar61 + 200);
      if (((iVar58 < 1 || (uVar43 & 1) != 0) || (iimage->height < iVar44)) ||
         (iVar31 = iVar1 + iVar58, iimage->width < iVar31)) {
        auVar101 = ZEXT1664(auVar101._0_16_);
        auVar102 = ZEXT1664(auVar102._0_16_);
        haarXY(iimage,auVar83._4_4_,iVar58,iVar64,pfVar53,pfVar54);
      }
      else {
        iVar47 = iVar58 + -1 + iVar64;
        pfVar57 = iimage->data;
        iVar33 = iimage->data_width;
        iVar39 = iVar33 * iVar46;
        fVar81 = pfVar57[iVar33 * iVar45 + -1 + iVar58];
        iVar50 = iVar33 * (iVar1 + -1 + auVar83._4_4_);
        fVar9 = pfVar57[iVar50 + -1 + iVar58];
        fVar10 = pfVar57[iVar50 + -1 + iVar31];
        fVar11 = pfVar57[iVar39 + -1 + iVar58];
        fVar87 = pfVar57[iVar39 + -1 + iVar31];
        fVar12 = pfVar57[iVar33 * iVar45 + -1 + iVar31];
        auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar57[iVar39 + iVar47] - pfVar57[iVar50 + iVar47]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar10 - fVar11)));
        *pfVar53 = (fVar9 - fVar87) + auVar67._0_4_;
        auVar67 = vfmadd213ss_fma(ZEXT416((uint)(fVar81 - fVar12)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar10 - fVar11)));
        *pfVar54 = auVar67._0_4_ - (fVar9 - fVar87);
      }
      pfVar53 = (float *)((long)haarResponseX + lVar61 + 0x128);
      pfVar54 = (float *)((long)haarResponseY + lVar61 + 0x128);
      if (((iVar58 < 1 || (uVar34 & 1) != 0) || (iimage->height < iVar48)) ||
         (iVar31 = iVar1 + iVar58, iimage->width < iVar31)) {
        auVar101 = ZEXT1664(auVar101._0_16_);
        auVar102 = ZEXT1664(auVar102._0_16_);
        haarXY(iimage,auVar83._0_4_,iVar58,iVar64,pfVar53,pfVar54);
      }
      else {
        iVar39 = iVar58 + -1 + iVar64;
        pfVar57 = iimage->data;
        iVar33 = iimage->data_width;
        iVar50 = iVar33 * iVar28;
        fVar81 = pfVar57[iVar33 * iVar49 + -1 + iVar58];
        iVar47 = iVar33 * (iVar1 + -1 + auVar83._0_4_);
        fVar9 = pfVar57[iVar47 + -1 + iVar58];
        fVar10 = pfVar57[iVar47 + -1 + iVar31];
        fVar11 = pfVar57[iVar50 + -1 + iVar58];
        fVar87 = pfVar57[iVar50 + -1 + iVar31];
        fVar12 = pfVar57[iVar33 * iVar49 + -1 + iVar31];
        auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar57[iVar50 + iVar39] - pfVar57[iVar47 + iVar39]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar10 - fVar11)));
        *pfVar53 = (fVar9 - fVar87) + auVar67._0_4_;
        auVar67 = vfmadd213ss_fma(ZEXT416((uint)(fVar81 - fVar12)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar10 - fVar11)));
        *pfVar54 = auVar67._0_4_ - (fVar9 - fVar87);
      }
      bVar66 = (byte)uVar19;
      auVar67 = vpermilpd_avx(auVar69,1);
      iVar58 = (int)((double)((ulong)(bVar66 >> 2 & 1) * 0x3fe0000000000000 +
                             (ulong)!(bool)(bVar66 >> 2 & 1) * -0x4020000000000000) +
                    (double)auVar67._0_4_);
      pfVar53 = (float *)((long)haarResponseX + lVar61 + 0xc);
      pfVar54 = (float *)((long)haarResponseY + lVar61 + 0xc);
      if (((iVar58 < 1 || uVar65 != 0) || (iimage->height < iVar29)) ||
         (iVar31 = iVar1 + iVar58, iimage->width < iVar31)) {
        auVar101 = ZEXT1664(auVar101._0_16_);
        auVar102 = ZEXT1664(auVar102._0_16_);
        haarXY(iimage,auVar83._12_4_,iVar58,iVar64,pfVar53,pfVar54);
      }
      else {
        iVar47 = iVar58 + -1 + iVar64;
        pfVar57 = iimage->data;
        iVar33 = iimage->data_width;
        iVar39 = iVar33 * iVar35;
        fVar81 = pfVar57[iVar33 * iVar30 + -1 + iVar58];
        iVar50 = iVar33 * (iVar1 + -1 + auVar83._12_4_);
        fVar9 = pfVar57[iVar50 + -1 + iVar58];
        fVar10 = pfVar57[iVar50 + -1 + iVar31];
        fVar11 = pfVar57[iVar39 + -1 + iVar58];
        fVar87 = pfVar57[iVar39 + -1 + iVar31];
        fVar12 = pfVar57[iVar33 * iVar30 + -1 + iVar31];
        auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar57[iVar39 + iVar47] - pfVar57[iVar50 + iVar47]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar10 - fVar11)));
        *pfVar53 = (fVar9 - fVar87) + auVar67._0_4_;
        auVar67 = vfmadd213ss_fma(ZEXT416((uint)(fVar81 - fVar12)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar10 - fVar11)));
        *pfVar54 = auVar67._0_4_ - (fVar9 - fVar87);
      }
      pfVar53 = (float *)((long)haarResponseX + lVar61 + 0x6c);
      pfVar54 = (float *)((long)haarResponseY + lVar61 + 0x6c);
      if (((iVar58 < 1 || (uVar40 & 1) != 0) || (iimage->height < iVar36)) ||
         (iVar31 = iVar1 + iVar58, iimage->width < iVar31)) {
        auVar101 = ZEXT1664(auVar101._0_16_);
        auVar102 = ZEXT1664(auVar102._0_16_);
        haarXY(iimage,auVar83._8_4_,iVar58,iVar64,pfVar53,pfVar54);
      }
      else {
        iVar47 = iVar58 + -1 + iVar64;
        pfVar57 = iimage->data;
        iVar33 = iimage->data_width;
        iVar39 = iVar33 * iVar38;
        fVar81 = pfVar57[iVar33 * iVar37 + -1 + iVar58];
        iVar50 = iVar33 * (iVar1 + -1 + auVar83._8_4_);
        fVar9 = pfVar57[iVar50 + -1 + iVar58];
        fVar10 = pfVar57[iVar50 + -1 + iVar31];
        fVar11 = pfVar57[iVar39 + -1 + iVar58];
        fVar87 = pfVar57[iVar39 + -1 + iVar31];
        fVar12 = pfVar57[iVar33 * iVar37 + -1 + iVar31];
        auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar57[iVar39 + iVar47] - pfVar57[iVar50 + iVar47]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar10 - fVar11)));
        *pfVar53 = (fVar9 - fVar87) + auVar67._0_4_;
        auVar67 = vfmadd213ss_fma(ZEXT416((uint)(fVar81 - fVar12)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar10 - fVar11)));
        *pfVar54 = auVar67._0_4_ - (fVar9 - fVar87);
      }
      pfVar53 = (float *)((long)haarResponseX + lVar61 + 0xcc);
      pfVar54 = (float *)((long)haarResponseY + lVar61 + 0xcc);
      if (((iVar58 < 1 || (uVar43 & 1) != 0) || (iimage->height < iVar44)) ||
         (iVar31 = iVar1 + iVar58, iimage->width < iVar31)) {
        auVar101 = ZEXT1664(auVar101._0_16_);
        auVar102 = ZEXT1664(auVar102._0_16_);
        haarXY(iimage,auVar83._4_4_,iVar58,iVar64,pfVar53,pfVar54);
      }
      else {
        iVar47 = iVar58 + -1 + iVar64;
        pfVar57 = iimage->data;
        iVar33 = iimage->data_width;
        iVar39 = iVar33 * iVar46;
        fVar81 = pfVar57[iVar33 * iVar45 + -1 + iVar58];
        iVar50 = iVar33 * (iVar1 + -1 + auVar83._4_4_);
        fVar9 = pfVar57[iVar50 + -1 + iVar58];
        fVar10 = pfVar57[iVar50 + -1 + iVar31];
        fVar11 = pfVar57[iVar39 + -1 + iVar58];
        fVar87 = pfVar57[iVar39 + -1 + iVar31];
        fVar12 = pfVar57[iVar33 * iVar45 + -1 + iVar31];
        auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar57[iVar39 + iVar47] - pfVar57[iVar50 + iVar47]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar10 - fVar11)));
        *pfVar53 = (fVar9 - fVar87) + auVar67._0_4_;
        auVar67 = vfmadd213ss_fma(ZEXT416((uint)(fVar81 - fVar12)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar10 - fVar11)));
        *pfVar54 = auVar67._0_4_ - (fVar9 - fVar87);
      }
      pfVar53 = (float *)((long)haarResponseX + lVar61 + 300);
      pfVar54 = (float *)((long)haarResponseY + lVar61 + 300);
      if (((iVar58 < 1 || (uVar34 & 1) != 0) || (iimage->height < iVar48)) ||
         (iVar31 = iVar1 + iVar58, iimage->width < iVar31)) {
        auVar101 = ZEXT1664(auVar101._0_16_);
        auVar102 = ZEXT1664(auVar102._0_16_);
        haarXY(iimage,auVar83._0_4_,iVar58,iVar64,pfVar53,pfVar54);
      }
      else {
        iVar39 = iVar58 + -1 + iVar64;
        pfVar57 = iimage->data;
        iVar33 = iimage->data_width;
        iVar50 = iVar33 * iVar28;
        fVar81 = pfVar57[iVar33 * iVar49 + -1 + iVar58];
        iVar47 = iVar33 * (iVar1 + -1 + auVar83._0_4_);
        fVar9 = pfVar57[iVar47 + -1 + iVar58];
        fVar10 = pfVar57[iVar47 + -1 + iVar31];
        fVar11 = pfVar57[iVar50 + -1 + iVar58];
        fVar87 = pfVar57[iVar50 + -1 + iVar31];
        fVar12 = pfVar57[iVar33 * iVar49 + -1 + iVar31];
        auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar57[iVar50 + iVar39] - pfVar57[iVar47 + iVar39]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar10 - fVar11)));
        *pfVar53 = (fVar9 - fVar87) + auVar67._0_4_;
        auVar67 = vfmadd213ss_fma(ZEXT416((uint)(fVar81 - fVar12)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar10 - fVar11)));
        *pfVar54 = auVar67._0_4_ - (fVar9 - fVar87);
      }
      auVar67 = vmovshdup_avx(auVar69);
      iVar58 = (int)((double)((ulong)(bVar66 >> 1 & 1) * 0x3fe0000000000000 +
                             (ulong)!(bool)(bVar66 >> 1 & 1) * -0x4020000000000000) +
                    (double)auVar67._0_4_);
      pfVar53 = (float *)((long)haarResponseX + lVar61 + 0x10);
      pfVar54 = (float *)((long)haarResponseY + lVar61 + 0x10);
      if (((iVar58 < 1 || uVar65 != 0) || (iimage->height < iVar29)) ||
         (iVar31 = iVar1 + iVar58, iimage->width < iVar31)) {
        auVar101 = ZEXT1664(auVar101._0_16_);
        auVar102 = ZEXT1664(auVar102._0_16_);
        haarXY(iimage,auVar83._12_4_,iVar58,iVar64,pfVar53,pfVar54);
      }
      else {
        iVar47 = iVar58 + -1 + iVar64;
        pfVar57 = iimage->data;
        iVar33 = iimage->data_width;
        iVar39 = iVar33 * iVar35;
        fVar81 = pfVar57[iVar33 * iVar30 + -1 + iVar58];
        iVar50 = iVar33 * (iVar1 + -1 + auVar83._12_4_);
        fVar9 = pfVar57[iVar50 + -1 + iVar58];
        fVar10 = pfVar57[iVar50 + -1 + iVar31];
        fVar11 = pfVar57[iVar39 + -1 + iVar58];
        fVar87 = pfVar57[iVar39 + -1 + iVar31];
        fVar12 = pfVar57[iVar33 * iVar30 + -1 + iVar31];
        auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar57[iVar39 + iVar47] - pfVar57[iVar50 + iVar47]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar10 - fVar11)));
        *pfVar53 = (fVar9 - fVar87) + auVar67._0_4_;
        auVar67 = vfmadd213ss_fma(ZEXT416((uint)(fVar81 - fVar12)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar10 - fVar11)));
        *pfVar54 = auVar67._0_4_ - (fVar9 - fVar87);
      }
      pfVar53 = (float *)((long)haarResponseX + lVar61 + 0x70);
      pfVar54 = (float *)((long)haarResponseY + lVar61 + 0x70);
      if (((iVar58 < 1 || (uVar40 & 1) != 0) || (iimage->height < iVar36)) ||
         (iVar31 = iVar1 + iVar58, iimage->width < iVar31)) {
        auVar101 = ZEXT1664(auVar101._0_16_);
        auVar102 = ZEXT1664(auVar102._0_16_);
        haarXY(iimage,auVar83._8_4_,iVar58,iVar64,pfVar53,pfVar54);
      }
      else {
        iVar47 = iVar58 + -1 + iVar64;
        pfVar57 = iimage->data;
        iVar33 = iimage->data_width;
        iVar39 = iVar33 * iVar38;
        fVar81 = pfVar57[iVar33 * iVar37 + -1 + iVar58];
        iVar50 = iVar33 * (iVar1 + -1 + auVar83._8_4_);
        fVar9 = pfVar57[iVar50 + -1 + iVar58];
        fVar10 = pfVar57[iVar50 + -1 + iVar31];
        fVar11 = pfVar57[iVar39 + -1 + iVar58];
        fVar87 = pfVar57[iVar39 + -1 + iVar31];
        fVar12 = pfVar57[iVar33 * iVar37 + -1 + iVar31];
        auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar57[iVar39 + iVar47] - pfVar57[iVar50 + iVar47]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar10 - fVar11)));
        *pfVar53 = (fVar9 - fVar87) + auVar67._0_4_;
        auVar67 = vfmadd213ss_fma(ZEXT416((uint)(fVar81 - fVar12)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar10 - fVar11)));
        *pfVar54 = auVar67._0_4_ - (fVar9 - fVar87);
      }
      pfVar53 = (float *)((long)haarResponseX + lVar61 + 0xd0);
      pfVar54 = (float *)((long)haarResponseY + lVar61 + 0xd0);
      if (((iVar58 < 1 || (uVar43 & 1) != 0) || (iimage->height < iVar44)) ||
         (iVar31 = iVar1 + iVar58, iimage->width < iVar31)) {
        auVar101 = ZEXT1664(auVar101._0_16_);
        auVar102 = ZEXT1664(auVar102._0_16_);
        haarXY(iimage,auVar83._4_4_,iVar58,iVar64,pfVar53,pfVar54);
      }
      else {
        iVar47 = iVar58 + -1 + iVar64;
        pfVar57 = iimage->data;
        iVar33 = iimage->data_width;
        iVar39 = iVar33 * iVar46;
        fVar81 = pfVar57[iVar33 * iVar45 + -1 + iVar58];
        iVar50 = iVar33 * (iVar1 + -1 + auVar83._4_4_);
        fVar9 = pfVar57[iVar50 + -1 + iVar58];
        fVar10 = pfVar57[iVar50 + -1 + iVar31];
        fVar11 = pfVar57[iVar39 + -1 + iVar58];
        fVar87 = pfVar57[iVar39 + -1 + iVar31];
        fVar12 = pfVar57[iVar33 * iVar45 + -1 + iVar31];
        auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar57[iVar39 + iVar47] - pfVar57[iVar50 + iVar47]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar10 - fVar11)));
        *pfVar53 = (fVar9 - fVar87) + auVar67._0_4_;
        auVar67 = vfmadd213ss_fma(ZEXT416((uint)(fVar81 - fVar12)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar10 - fVar11)));
        *pfVar54 = auVar67._0_4_ - (fVar9 - fVar87);
      }
      pfVar53 = (float *)((long)haarResponseX + lVar61 + 0x130);
      pfVar54 = (float *)((long)haarResponseY + lVar61 + 0x130);
      if (((iVar58 < 1 || (uVar34 & 1) != 0) || (iimage->height < iVar48)) ||
         (iVar31 = iVar1 + iVar58, iimage->width < iVar31)) {
        auVar101 = ZEXT1664(auVar101._0_16_);
        auVar102 = ZEXT1664(auVar102._0_16_);
        haarXY(iimage,auVar83._0_4_,iVar58,iVar64,pfVar53,pfVar54);
      }
      else {
        iVar39 = iVar58 + -1 + iVar64;
        pfVar57 = iimage->data;
        iVar33 = iimage->data_width;
        iVar50 = iVar33 * iVar28;
        fVar81 = pfVar57[iVar33 * iVar49 + -1 + iVar58];
        iVar47 = iVar33 * (iVar1 + -1 + auVar83._0_4_);
        fVar9 = pfVar57[iVar47 + -1 + iVar58];
        fVar10 = pfVar57[iVar47 + -1 + iVar31];
        fVar11 = pfVar57[iVar50 + -1 + iVar58];
        fVar87 = pfVar57[iVar50 + -1 + iVar31];
        fVar12 = pfVar57[iVar33 * iVar49 + -1 + iVar31];
        auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar57[iVar50 + iVar39] - pfVar57[iVar47 + iVar39]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar10 - fVar11)));
        *pfVar53 = (fVar9 - fVar87) + auVar67._0_4_;
        auVar67 = vfmadd213ss_fma(ZEXT416((uint)(fVar81 - fVar12)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar10 - fVar11)));
        *pfVar54 = auVar67._0_4_ - (fVar9 - fVar87);
      }
      local_118 = auVar69._0_4_;
      iVar58 = (int)((double)((ulong)(bVar66 & 1) * 0x3fe0000000000000 +
                             (ulong)!(bool)(bVar66 & 1) * -0x4020000000000000) + (double)local_118);
      pfVar53 = (float *)((long)haarResponseX + lVar61 + 0x14);
      pfVar54 = (float *)((long)haarResponseY + lVar61 + 0x14);
      if (((iVar58 < 1 || uVar65 != 0) || (iimage->height < iVar29)) ||
         (iVar31 = iVar1 + iVar58, iimage->width < iVar31)) {
        auVar101 = ZEXT1664(auVar101._0_16_);
        auVar102 = ZEXT1664(auVar102._0_16_);
        haarXY(iimage,auVar83._12_4_,iVar58,iVar64,pfVar53,pfVar54);
      }
      else {
        iVar47 = iVar58 + -1 + iVar64;
        pfVar57 = iimage->data;
        iVar33 = iimage->data_width;
        iVar39 = iVar33 * iVar35;
        fVar81 = pfVar57[iVar33 * iVar30 + -1 + iVar58];
        iVar50 = iVar33 * (iVar1 + -1 + auVar83._12_4_);
        fVar9 = pfVar57[iVar50 + -1 + iVar58];
        fVar10 = pfVar57[iVar50 + -1 + iVar31];
        fVar11 = pfVar57[iVar39 + -1 + iVar58];
        fVar87 = pfVar57[iVar39 + -1 + iVar31];
        fVar12 = pfVar57[iVar33 * iVar30 + -1 + iVar31];
        auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar57[iVar39 + iVar47] - pfVar57[iVar50 + iVar47]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar10 - fVar11)));
        *pfVar53 = (fVar9 - fVar87) + auVar67._0_4_;
        auVar67 = vfmadd213ss_fma(ZEXT416((uint)(fVar81 - fVar12)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar10 - fVar11)));
        *pfVar54 = auVar67._0_4_ - (fVar9 - fVar87);
      }
      pfVar53 = (float *)((long)haarResponseX + lVar61 + 0x74);
      pfVar54 = (float *)((long)haarResponseY + lVar61 + 0x74);
      if (((iVar58 < 1 || (uVar40 & 1) != 0) || (iimage->height < iVar36)) ||
         (iVar31 = iVar1 + iVar58, iimage->width < iVar31)) {
        auVar101 = ZEXT1664(auVar101._0_16_);
        auVar102 = ZEXT1664(auVar102._0_16_);
        haarXY(iimage,auVar83._8_4_,iVar58,iVar64,pfVar53,pfVar54);
      }
      else {
        iVar47 = iVar58 + -1 + iVar64;
        pfVar57 = iimage->data;
        iVar33 = iimage->data_width;
        iVar39 = iVar33 * iVar38;
        fVar81 = pfVar57[iVar33 * iVar37 + -1 + iVar58];
        iVar50 = iVar33 * (iVar1 + -1 + auVar83._8_4_);
        fVar9 = pfVar57[iVar50 + -1 + iVar58];
        fVar10 = pfVar57[iVar50 + -1 + iVar31];
        fVar11 = pfVar57[iVar39 + -1 + iVar58];
        fVar87 = pfVar57[iVar39 + -1 + iVar31];
        fVar12 = pfVar57[iVar33 * iVar37 + -1 + iVar31];
        auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar57[iVar39 + iVar47] - pfVar57[iVar50 + iVar47]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar10 - fVar11)));
        *pfVar53 = (fVar9 - fVar87) + auVar67._0_4_;
        auVar67 = vfmadd213ss_fma(ZEXT416((uint)(fVar81 - fVar12)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar10 - fVar11)));
        *pfVar54 = auVar67._0_4_ - (fVar9 - fVar87);
      }
      pfVar53 = (float *)((long)haarResponseX + lVar61 + 0xd4);
      pfVar54 = (float *)((long)haarResponseY + lVar61 + 0xd4);
      if (((iVar58 < 1 || (uVar43 & 1) != 0) || (iimage->height < iVar44)) ||
         (iVar31 = iVar1 + iVar58, iimage->width < iVar31)) {
        auVar101 = ZEXT1664(auVar101._0_16_);
        auVar102 = ZEXT1664(auVar102._0_16_);
        haarXY(iimage,auVar83._4_4_,iVar58,iVar64,pfVar53,pfVar54);
      }
      else {
        iVar47 = iVar58 + -1 + iVar64;
        pfVar57 = iimage->data;
        iVar33 = iimage->data_width;
        iVar39 = iVar33 * iVar46;
        fVar81 = pfVar57[iVar33 * iVar45 + -1 + iVar58];
        iVar50 = iVar33 * (iVar1 + -1 + auVar83._4_4_);
        fVar9 = pfVar57[iVar50 + -1 + iVar58];
        fVar10 = pfVar57[iVar50 + -1 + iVar31];
        fVar11 = pfVar57[iVar39 + -1 + iVar58];
        fVar87 = pfVar57[iVar39 + -1 + iVar31];
        fVar12 = pfVar57[iVar33 * iVar45 + -1 + iVar31];
        auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar57[iVar39 + iVar47] - pfVar57[iVar50 + iVar47]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar10 - fVar11)));
        *pfVar53 = (fVar9 - fVar87) + auVar67._0_4_;
        auVar67 = vfmadd213ss_fma(ZEXT416((uint)(fVar81 - fVar12)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar10 - fVar11)));
        *pfVar54 = auVar67._0_4_ - (fVar9 - fVar87);
      }
      pfVar53 = (float *)((long)haarResponseX + lVar61 + 0x134);
      pfVar54 = (float *)((long)haarResponseY + lVar61 + 0x134);
      if (((iVar58 < 1 || (uVar34 & 1) != 0) || (iimage->height < iVar48)) ||
         (iVar31 = iVar1 + iVar58, iimage->width < iVar31)) {
        auVar101 = ZEXT1664(auVar101._0_16_);
        auVar102 = ZEXT1664(auVar102._0_16_);
        haarXY(iimage,auVar83._0_4_,iVar58,iVar64,pfVar53,pfVar54);
      }
      else {
        iVar39 = iVar58 + -1 + iVar64;
        pfVar57 = iimage->data;
        iVar33 = iimage->data_width;
        iVar50 = iVar33 * iVar28;
        fVar81 = pfVar57[iVar33 * iVar49 + -1 + iVar58];
        iVar47 = iVar33 * (iVar1 + -1 + auVar83._0_4_);
        fVar9 = pfVar57[iVar47 + -1 + iVar58];
        fVar10 = pfVar57[iVar47 + -1 + iVar31];
        fVar11 = pfVar57[iVar50 + -1 + iVar58];
        fVar87 = pfVar57[iVar50 + -1 + iVar31];
        fVar12 = pfVar57[iVar33 * iVar49 + -1 + iVar31];
        auVar67 = vfmadd213ss_fma(ZEXT416((uint)(pfVar57[iVar50 + iVar39] - pfVar57[iVar47 + iVar39]
                                                )),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar10 - fVar11)));
        *pfVar53 = (fVar9 - fVar87) + auVar67._0_4_;
        auVar67 = vfmadd213ss_fma(ZEXT416((uint)(fVar81 - fVar12)),SUB6416(ZEXT464(0x40000000),0),
                                  ZEXT416((uint)(fVar10 - fVar11)));
        *pfVar54 = auVar67._0_4_ - (fVar9 - fVar87);
      }
      auVar108 = ZEXT1664(auVar68);
      lVar61 = lVar61 + 0x18;
      bVar2 = iVar42 < 6;
      iVar42 = iVar42 + 6;
    } while (bVar2);
    lVar62 = lVar62 + 0x180;
    bVar2 = (int)uVar32 < 8;
    uVar32 = uVar32 + 4;
  } while (bVar2);
LAB_00225fc3:
  fVar82 = auVar108._0_4_;
  auVar107._8_4_ = 0x3effffff;
  auVar107._0_8_ = 0x3effffff3effffff;
  auVar107._12_4_ = 0x3effffff;
  auVar106._8_4_ = 0x80000000;
  auVar106._0_8_ = 0x8000000080000000;
  auVar106._12_4_ = 0x80000000;
  auVar67 = vpternlogd_avx512vl(auVar107,ZEXT416((uint)(fVar82 * 0.5)),auVar106,0xf8);
  auVar67 = ZEXT416((uint)(fVar82 * 0.5 + auVar67._0_4_));
  auVar67 = vroundss_avx(auVar67,auVar67,0xb);
  auVar68 = vpternlogd_avx512vl(auVar107,ZEXT416((uint)(fVar82 * 1.5)),auVar106,0xf8);
  auVar68 = ZEXT416((uint)(fVar82 * 1.5 + auVar68._0_4_));
  auVar68 = vroundss_avx(auVar68,auVar68,0xb);
  auVar69 = vpternlogd_avx512vl(auVar107,ZEXT416((uint)(fVar82 * 2.5)),auVar106,0xf8);
  auVar69 = ZEXT416((uint)(fVar82 * 2.5 + auVar69._0_4_));
  auVar69 = vroundss_avx(auVar69,auVar69,0xb);
  auVar70 = vpternlogd_avx512vl(auVar107,ZEXT416((uint)(fVar82 * 3.5)),auVar106,0xf8);
  auVar70 = ZEXT416((uint)(fVar82 * 3.5 + auVar70._0_4_));
  auVar70 = vroundss_avx(auVar70,auVar70,0xb);
  auVar71 = vpternlogd_avx512vl(auVar107,ZEXT416((uint)(fVar82 * 4.5)),auVar106,0xf8);
  auVar71 = ZEXT416((uint)(fVar82 * 4.5 + auVar71._0_4_));
  auVar71 = vroundss_avx(auVar71,auVar71,0xb);
  auVar72 = vpternlogd_avx512vl(auVar107,ZEXT416((uint)(fVar82 * 5.5)),auVar106,0xf8);
  auVar72 = ZEXT416((uint)(fVar82 * 5.5 + auVar72._0_4_));
  auVar72 = vroundss_avx(auVar72,auVar72,0xb);
  auVar73 = vpternlogd_avx512vl(auVar107,ZEXT416((uint)(fVar82 * 6.5)),auVar106,0xf8);
  auVar73 = ZEXT416((uint)(fVar82 * 6.5 + auVar73._0_4_));
  auVar73 = vroundss_avx(auVar73,auVar73,0xb);
  auVar74 = vpternlogd_avx512vl(auVar107,ZEXT416((uint)(fVar82 * 7.5)),auVar106,0xf8);
  auVar74 = ZEXT416((uint)(auVar74._0_4_ + fVar82 * 7.5));
  auVar74 = vroundss_avx(auVar74,auVar74,0xb);
  auVar75 = vpternlogd_avx512vl(auVar107,ZEXT416((uint)(fVar82 * 8.5)),auVar106,0xf8);
  auVar75 = ZEXT416((uint)(fVar82 * 8.5 + auVar75._0_4_));
  auVar75 = vroundss_avx(auVar75,auVar75,0xb);
  auVar76 = vpternlogd_avx512vl(auVar107,ZEXT416((uint)(fVar82 * 9.5)),auVar106,0xf8);
  auVar76 = ZEXT416((uint)(fVar82 * 9.5 + auVar76._0_4_));
  auVar76 = vroundss_avx(auVar76,auVar76,0xb);
  auVar77 = vpternlogd_avx512vl(auVar107,ZEXT416((uint)(fVar82 * 10.5)),auVar106,0xf8);
  auVar77 = ZEXT416((uint)(fVar82 * 10.5 + auVar77._0_4_));
  auVar77 = vroundss_avx(auVar77,auVar77,0xb);
  auVar78 = vpternlogd_avx512vl(auVar107,ZEXT416((uint)(fVar82 * 11.5)),auVar106,0xf8);
  auVar78 = ZEXT416((uint)(fVar82 * 11.5 + auVar78._0_4_));
  auVar78 = vroundss_avx(auVar78,auVar78,0xb);
  fVar87 = auVar69._0_4_;
  fVar82 = fVar87 + auVar68._0_4_;
  fVar7 = fVar87 + auVar67._0_4_;
  fVar8 = fVar87 - auVar67._0_4_;
  fVar81 = fVar87 - auVar68._0_4_;
  fVar9 = fVar87 - auVar70._0_4_;
  fVar10 = fVar87 - auVar71._0_4_;
  fVar11 = fVar87 - auVar72._0_4_;
  fVar87 = fVar87 - auVar73._0_4_;
  fVar103 = auVar74._0_4_;
  fVar12 = fVar103 - auVar70._0_4_;
  fVar13 = fVar103 - auVar71._0_4_;
  fVar14 = fVar103 - auVar72._0_4_;
  fVar15 = fVar103 - auVar73._0_4_;
  fVar16 = fVar103 - auVar75._0_4_;
  fVar17 = fVar103 - auVar76._0_4_;
  fVar18 = fVar103 - auVar77._0_4_;
  fVar103 = fVar103 - auVar78._0_4_;
  gauss_s1_c0[0] = expf(fVar82 * fVar82 * fVar80);
  gauss_s1_c0[1] = expf(fVar7 * fVar7 * fVar80);
  gauss_s1_c0[2] = expf(fVar8 * fVar8 * fVar80);
  gauss_s1_c0[3] = expf(fVar81 * fVar81 * fVar80);
  gauss_s1_c0[4] = 1.0;
  gauss_s1_c0[5] = expf(fVar9 * fVar9 * fVar80);
  gauss_s1_c0[6] = expf(fVar10 * fVar10 * fVar80);
  gauss_s1_c0[7] = expf(fVar11 * fVar11 * fVar80);
  gauss_s1_c0[8] = expf(fVar87 * fVar87 * fVar80);
  gauss_s1_c1[0] = expf(fVar12 * fVar12 * fVar80);
  gauss_s1_c1[1] = expf(fVar13 * fVar13 * fVar80);
  gauss_s1_c1[2] = expf(fVar14 * fVar14 * fVar80);
  gauss_s1_c1[3] = expf(fVar15 * fVar15 * fVar80);
  gauss_s1_c1[4] = 1.0;
  gauss_s1_c1[5] = expf(fVar16 * fVar16 * fVar80);
  gauss_s1_c1[6] = expf(fVar17 * fVar17 * fVar80);
  gauss_s1_c1[7] = expf(fVar18 * fVar18 * fVar80);
  gauss_s1_c1[8] = expf(fVar103 * fVar103 * fVar80);
  uVar34 = 0xfffffff8;
  lVar62 = 0;
  fVar82 = 0.0;
  auVar86._8_4_ = 0x7fffffff;
  auVar86._0_8_ = 0x7fffffff7fffffff;
  auVar86._12_4_ = 0x7fffffff;
  lVar61 = 0;
  lVar55 = 0;
  do {
    pfVar53 = gauss_s1_c1;
    uVar32 = (uint)uVar34;
    if (uVar32 != 7) {
      pfVar53 = gauss_s1_c0;
    }
    if (uVar32 == 0xfffffff8) {
      pfVar53 = gauss_s1_c1;
    }
    lVar61 = (long)(int)lVar61;
    iVar64 = (int)lVar55;
    lVar55 = (long)iVar64;
    lVar52 = (long)haarResponseX + lVar62;
    lVar41 = (long)haarResponseY + lVar62;
    uVar51 = 0xfffffff8;
    uVar43 = 0;
    do {
      pfVar54 = gauss_s1_c1;
      if (uVar51 != 7) {
        pfVar54 = gauss_s1_c0;
      }
      if (uVar51 == 0xfffffff8) {
        pfVar54 = gauss_s1_c1;
      }
      uVar65 = (ulong)(uVar51 >> 0x1c & 0xfffffff8);
      auVar101 = ZEXT1664(ZEXT816(0) << 0x40);
      uVar40 = uVar43;
      lVar60 = lVar52;
      lVar63 = lVar41;
      do {
        lVar56 = 0;
        pfVar57 = (float *)((long)pfVar53 + (ulong)(uint)((int)(uVar34 >> 0x1f) << 5));
        do {
          fVar7 = pfVar54[uVar65] * *pfVar57;
          auVar67 = vinsertps_avx(ZEXT416(*(uint *)(lVar63 + lVar56 * 4)),
                                  ZEXT416(*(uint *)(lVar60 + lVar56 * 4)),0x10);
          auVar98._0_4_ = fVar7 * auVar67._0_4_;
          auVar98._4_4_ = fVar7 * auVar67._4_4_;
          auVar98._8_4_ = fVar7 * auVar67._8_4_;
          auVar98._12_4_ = fVar7 * auVar67._12_4_;
          auVar67 = vandps_avx(auVar98,auVar86);
          auVar67 = vmovlhps_avx(auVar98,auVar67);
          auVar88._0_4_ = auVar101._0_4_ + auVar67._0_4_;
          auVar88._4_4_ = auVar101._4_4_ + auVar67._4_4_;
          auVar88._8_4_ = auVar101._8_4_ + auVar67._8_4_;
          auVar88._12_4_ = auVar101._12_4_ + auVar67._12_4_;
          auVar101 = ZEXT1664(auVar88);
          pfVar57 = pfVar57 + (ulong)(~uVar32 >> 0x1f) * 2 + -1;
          lVar56 = lVar56 + 1;
        } while (lVar56 != 9);
        uVar40 = uVar40 + 0x18;
        uVar65 = uVar65 + (ulong)(-1 < (int)uVar51) * 2 + -1;
        lVar60 = lVar60 + 0x60;
        lVar63 = lVar63 + 0x60;
      } while (uVar40 < uVar51 * 0x18 + 0x198);
      fVar7 = gauss_s2_arr[lVar55];
      auVar23._4_4_ = fVar7;
      auVar23._0_4_ = fVar7;
      auVar23._8_4_ = fVar7;
      auVar23._12_4_ = fVar7;
      auVar69 = vmulps_avx512vl(auVar88,auVar23);
      lVar55 = lVar55 + 1;
      *(undefined1 (*) [16])(ipoint->descriptor + lVar61) = auVar69;
      auVar89._0_4_ = auVar69._0_4_ * auVar69._0_4_;
      auVar89._4_4_ = auVar69._4_4_ * auVar69._4_4_;
      auVar89._8_4_ = auVar69._8_4_ * auVar69._8_4_;
      auVar89._12_4_ = auVar69._12_4_ * auVar69._12_4_;
      auVar67 = vmovshdup_avx(auVar89);
      auVar68 = vfmadd231ss_fma(auVar67,auVar69,auVar69);
      auVar67 = vshufpd_avx(auVar69,auVar69,1);
      auVar68 = vfmadd213ss_fma(auVar67,auVar67,auVar68);
      auVar67 = vshufps_avx(auVar69,auVar69,0xff);
      auVar67 = vfmadd213ss_fma(auVar67,auVar67,auVar68);
      fVar82 = fVar82 + auVar67._0_4_;
      lVar61 = lVar61 + 4;
      uVar51 = uVar51 + 5;
      uVar43 = uVar43 + 0x78;
      lVar52 = lVar52 + 0x1e0;
      lVar41 = lVar41 + 0x1e0;
    } while (iVar64 + 4 != (int)lVar55);
    lVar62 = lVar62 + 0x14;
    uVar34 = (ulong)(uVar32 + 5);
  } while ((int)uVar32 < 3);
  if (fVar82 < 0.0) {
    fVar82 = sqrtf(fVar82);
  }
  else {
    auVar67 = vsqrtss_avx(ZEXT416((uint)fVar82),ZEXT416((uint)fVar82));
    fVar82 = auVar67._0_4_;
  }
  auVar101 = vbroadcastss_avx512f(ZEXT416((uint)(1.0 / fVar82)));
  lVar62 = 0;
  do {
    auVar102 = vmulps_avx512f(auVar101,*(undefined1 (*) [64])(ipoint->descriptor + lVar62));
    *(undefined1 (*) [64])(ipoint->descriptor + lVar62) = auVar102;
    lVar62 = lVar62 + 0x10;
  } while (lVar62 != 0x40);
  return;
}

Assistant:

void get_msurf_descriptor_haar_unroll_4_6_True(struct integral_image* iimage, struct interest_point* ipoint) {

    float scale = ipoint->scale;
    int int_scale = (int) roundf(scale);
    float scale_squared = scale*scale;
    float g1_factor = -0.08f / (scale_squared); 

    float ipoint_x = roundf(ipoint->x) + 0.5*scale;
    float ipoint_y = roundf(ipoint->y) + 0.5*scale;

    float ipoint_x_sub_int_scale = ipoint_x-int_scale;
    float ipoint_y_sub_int_scale = ipoint_y-int_scale;

    float ipoint_x_sub_int_scale_add_05 = ipoint_x-int_scale + 0.5;
    float ipoint_y_sub_int_scale_add_05 = ipoint_y-int_scale + 0.5;
    
    int width = iimage->width;
    int height = iimage->height;

    // build descriptor
    float* descriptor = ipoint->descriptor;
    int desc_idx = 0;
    float sum_of_squares = 0.0f;

    // Initializing gauss_s2 index for precomputed array
    int gauss_s2_index = 0;

    // check if we ever hit a boundary
    if (((int) roundf(ipoint_x - 12*scale)) - int_scale <= 0 
        || ((int) roundf(ipoint_y - 12*scale)) - int_scale <= 0 
        || ((int) roundf(ipoint_x + 11*scale)) + int_scale > width 
        || ((int) roundf(ipoint_y + 11*scale)) + int_scale > height) 
    {
        for (int l=-12, l_count=0; l<12; l+=4, l_count+=4) {
            int l0 = l + 0;
            int l1 = l + 1;
            int l2 = l + 2;
            int l3 = l + 3;
            int l_count0 = l_count + 0;
            int l_count1 = l_count + 1;
            int l_count2 = l_count + 2;
            int l_count3 = l_count + 3;
            float ipoint_y_sub_int_scale_add_l0_mul_scale = ipoint_y_sub_int_scale + l0 * scale;
            float ipoint_y_sub_int_scale_add_l1_mul_scale = ipoint_y_sub_int_scale + l1 * scale;
            float ipoint_y_sub_int_scale_add_l2_mul_scale = ipoint_y_sub_int_scale + l2 * scale;
            float ipoint_y_sub_int_scale_add_l3_mul_scale = ipoint_y_sub_int_scale + l3 * scale;
            int sample_y_sub_int_scale0 = (int) (ipoint_y_sub_int_scale_add_l0_mul_scale + (ipoint_y_sub_int_scale_add_l0_mul_scale>=0 ? 0.5 : -0.5));
            int sample_y_sub_int_scale1 = (int) (ipoint_y_sub_int_scale_add_l1_mul_scale + (ipoint_y_sub_int_scale_add_l1_mul_scale>=0 ? 0.5 : -0.5));
            int sample_y_sub_int_scale2 = (int) (ipoint_y_sub_int_scale_add_l2_mul_scale + (ipoint_y_sub_int_scale_add_l2_mul_scale>=0 ? 0.5 : -0.5));
            int sample_y_sub_int_scale3 = (int) (ipoint_y_sub_int_scale_add_l3_mul_scale + (ipoint_y_sub_int_scale_add_l3_mul_scale>=0 ? 0.5 : -0.5));

            for (int k=-12, k_count=0; k<12; k+=6, k_count+=6) {
                int k0 = k + 0;
                int k1 = k + 1;
                int k2 = k + 2;
                int k3 = k + 3;
                int k4 = k + 4;
                int k5 = k + 5;
                int k_count0 = k_count + 0;
                int k_count1 = k_count + 1;
                int k_count2 = k_count + 2;
                int k_count3 = k_count + 3;
                int k_count4 = k_count + 4;
                int k_count5 = k_count + 5;
                float ipoint_x_sub_int_scale_add_k0_mul_scale = ipoint_x_sub_int_scale + k0 * scale;
                float ipoint_x_sub_int_scale_add_k1_mul_scale = ipoint_x_sub_int_scale + k1 * scale;
                float ipoint_x_sub_int_scale_add_k2_mul_scale = ipoint_x_sub_int_scale + k2 * scale;
                float ipoint_x_sub_int_scale_add_k3_mul_scale = ipoint_x_sub_int_scale + k3 * scale;
                float ipoint_x_sub_int_scale_add_k4_mul_scale = ipoint_x_sub_int_scale + k4 * scale;
                float ipoint_x_sub_int_scale_add_k5_mul_scale = ipoint_x_sub_int_scale + k5 * scale;
                int sample_x_sub_int_scale0 = (int) (ipoint_x_sub_int_scale_add_k0_mul_scale + (ipoint_x_sub_int_scale_add_k0_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale1 = (int) (ipoint_x_sub_int_scale_add_k1_mul_scale + (ipoint_x_sub_int_scale_add_k1_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale2 = (int) (ipoint_x_sub_int_scale_add_k2_mul_scale + (ipoint_x_sub_int_scale_add_k2_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale3 = (int) (ipoint_x_sub_int_scale_add_k3_mul_scale + (ipoint_x_sub_int_scale_add_k3_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale4 = (int) (ipoint_x_sub_int_scale_add_k4_mul_scale + (ipoint_x_sub_int_scale_add_k4_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale5 = (int) (ipoint_x_sub_int_scale_add_k5_mul_scale + (ipoint_x_sub_int_scale_add_k5_mul_scale>=0 ? 0.5 : -0.5));

                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count0*24+k_count0], &haarResponseY[l_count0*24+k_count0]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count1*24+k_count0], &haarResponseY[l_count1*24+k_count0]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale2, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count2*24+k_count0], &haarResponseY[l_count2*24+k_count0]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale3, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count3*24+k_count0], &haarResponseY[l_count3*24+k_count0]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count0*24+k_count1], &haarResponseY[l_count0*24+k_count1]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count1*24+k_count1], &haarResponseY[l_count1*24+k_count1]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale2, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count2*24+k_count1], &haarResponseY[l_count2*24+k_count1]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale3, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count3*24+k_count1], &haarResponseY[l_count3*24+k_count1]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count0*24+k_count2], &haarResponseY[l_count0*24+k_count2]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count1*24+k_count2], &haarResponseY[l_count1*24+k_count2]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale2, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count2*24+k_count2], &haarResponseY[l_count2*24+k_count2]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale3, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count3*24+k_count2], &haarResponseY[l_count3*24+k_count2]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale3, int_scale, &haarResponseX[l_count0*24+k_count3], &haarResponseY[l_count0*24+k_count3]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale3, int_scale, &haarResponseX[l_count1*24+k_count3], &haarResponseY[l_count1*24+k_count3]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale2, sample_x_sub_int_scale3, int_scale, &haarResponseX[l_count2*24+k_count3], &haarResponseY[l_count2*24+k_count3]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale3, sample_x_sub_int_scale3, int_scale, &haarResponseX[l_count3*24+k_count3], &haarResponseY[l_count3*24+k_count3]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale4, int_scale, &haarResponseX[l_count0*24+k_count4], &haarResponseY[l_count0*24+k_count4]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale4, int_scale, &haarResponseX[l_count1*24+k_count4], &haarResponseY[l_count1*24+k_count4]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale2, sample_x_sub_int_scale4, int_scale, &haarResponseX[l_count2*24+k_count4], &haarResponseY[l_count2*24+k_count4]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale3, sample_x_sub_int_scale4, int_scale, &haarResponseX[l_count3*24+k_count4], &haarResponseY[l_count3*24+k_count4]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale5, int_scale, &haarResponseX[l_count0*24+k_count5], &haarResponseY[l_count0*24+k_count5]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale5, int_scale, &haarResponseX[l_count1*24+k_count5], &haarResponseY[l_count1*24+k_count5]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale2, sample_x_sub_int_scale5, int_scale, &haarResponseX[l_count2*24+k_count5], &haarResponseY[l_count2*24+k_count5]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale3, sample_x_sub_int_scale5, int_scale, &haarResponseX[l_count3*24+k_count5], &haarResponseY[l_count3*24+k_count5]);
            }
        }
    } else {
        for (int l=-12, l_count=0; l<12; l+=4, l_count+=4) {
            int l0 = l + 0;
            int l1 = l + 1;
            int l2 = l + 2;
            int l3 = l + 3;
            int l_count0 = l_count + 0;
            int l_count1 = l_count + 1;
            int l_count2 = l_count + 2;
            int l_count3 = l_count + 3;
            int sample_y_sub_int_scale0 = (int) (ipoint_y_sub_int_scale_add_05 + l0 * scale);
            int sample_y_sub_int_scale1 = (int) (ipoint_y_sub_int_scale_add_05 + l1 * scale);
            int sample_y_sub_int_scale2 = (int) (ipoint_y_sub_int_scale_add_05 + l2 * scale);
            int sample_y_sub_int_scale3 = (int) (ipoint_y_sub_int_scale_add_05 + l3 * scale);

            for (int k=-12, k_count=0; k<12; k+=6, k_count+=6) {
                int k0 = k + 0;
                int k1 = k + 1;
                int k2 = k + 2;
                int k3 = k + 3;
                int k4 = k + 4;
                int k5 = k + 5;
                int k_count0 = k_count + 0;
                int k_count1 = k_count + 1;
                int k_count2 = k_count + 2;
                int k_count3 = k_count + 3;
                int k_count4 = k_count + 4;
                int k_count5 = k_count + 5;
                int sample_x_sub_int_scale0 = (int) (ipoint_x_sub_int_scale_add_05 + k0 * scale);
                int sample_x_sub_int_scale1 = (int) (ipoint_x_sub_int_scale_add_05 + k1 * scale);
                int sample_x_sub_int_scale2 = (int) (ipoint_x_sub_int_scale_add_05 + k2 * scale);
                int sample_x_sub_int_scale3 = (int) (ipoint_x_sub_int_scale_add_05 + k3 * scale);
                int sample_x_sub_int_scale4 = (int) (ipoint_x_sub_int_scale_add_05 + k4 * scale);
                int sample_x_sub_int_scale5 = (int) (ipoint_x_sub_int_scale_add_05 + k5 * scale);

                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count0*24+k_count0], &haarResponseY[l_count0*24+k_count0]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count1*24+k_count0], &haarResponseY[l_count1*24+k_count0]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale2, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count2*24+k_count0], &haarResponseY[l_count2*24+k_count0]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale3, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count3*24+k_count0], &haarResponseY[l_count3*24+k_count0]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count0*24+k_count1], &haarResponseY[l_count0*24+k_count1]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count1*24+k_count1], &haarResponseY[l_count1*24+k_count1]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale2, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count2*24+k_count1], &haarResponseY[l_count2*24+k_count1]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale3, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count3*24+k_count1], &haarResponseY[l_count3*24+k_count1]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count0*24+k_count2], &haarResponseY[l_count0*24+k_count2]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count1*24+k_count2], &haarResponseY[l_count1*24+k_count2]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale2, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count2*24+k_count2], &haarResponseY[l_count2*24+k_count2]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale3, sample_x_sub_int_scale2, int_scale, &haarResponseX[l_count3*24+k_count2], &haarResponseY[l_count3*24+k_count2]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale3, int_scale, &haarResponseX[l_count0*24+k_count3], &haarResponseY[l_count0*24+k_count3]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale3, int_scale, &haarResponseX[l_count1*24+k_count3], &haarResponseY[l_count1*24+k_count3]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale2, sample_x_sub_int_scale3, int_scale, &haarResponseX[l_count2*24+k_count3], &haarResponseY[l_count2*24+k_count3]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale3, sample_x_sub_int_scale3, int_scale, &haarResponseX[l_count3*24+k_count3], &haarResponseY[l_count3*24+k_count3]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale4, int_scale, &haarResponseX[l_count0*24+k_count4], &haarResponseY[l_count0*24+k_count4]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale4, int_scale, &haarResponseX[l_count1*24+k_count4], &haarResponseY[l_count1*24+k_count4]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale2, sample_x_sub_int_scale4, int_scale, &haarResponseX[l_count2*24+k_count4], &haarResponseY[l_count2*24+k_count4]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale3, sample_x_sub_int_scale4, int_scale, &haarResponseX[l_count3*24+k_count4], &haarResponseY[l_count3*24+k_count4]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale5, int_scale, &haarResponseX[l_count0*24+k_count5], &haarResponseY[l_count0*24+k_count5]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale5, int_scale, &haarResponseX[l_count1*24+k_count5], &haarResponseY[l_count1*24+k_count5]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale2, sample_x_sub_int_scale5, int_scale, &haarResponseX[l_count2*24+k_count5], &haarResponseY[l_count2*24+k_count5]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale3, sample_x_sub_int_scale5, int_scale, &haarResponseX[l_count3*24+k_count5], &haarResponseY[l_count3*24+k_count5]);
            }
        }
    }

    float s0  = roundf( 0.5 * scale);
    float s1  = roundf( 1.5 * scale);
    float s2  = roundf( 2.5 * scale);
    float s3  = roundf( 3.5 * scale);
    float s4  = roundf( 4.5 * scale);
    float s5  = roundf( 5.5 * scale);
    float s6  = roundf( 6.5 * scale);
    float s7  = roundf( 7.5 * scale);
    float s8  = roundf( 8.5 * scale);
    float s9  = roundf( 9.5 * scale);
    float s10 = roundf(10.5 * scale);
    float s11 = roundf(11.5 * scale);

    float e_c0_m4 = s2 + s1; // CAREFUL HERE!
    float e_c0_m3 = s2 + s0; // CAREFUL HERE!
    float e_c0_m2 = s2 - s0;
    float e_c0_m1 = s2 - s1;
    //float e_c0_z0 = s2 - s2;
    float e_c0_p1 = s2 - s3;
    float e_c0_p2 = s2 - s4;
    float e_c0_p3 = s2 - s5;
    float e_c0_p4 = s2 - s6;

    float e_c1_m4 = s7 - s3;
    float e_c1_m3 = s7 - s4;
    float e_c1_m2 = s7 - s5;
    float e_c1_m1 = s7 - s6;
    //float e_c1_z0 = s7 - s7;
    float e_c1_p1 = s7 - s8;
    float e_c1_p2 = s7 - s9;
    float e_c1_p3 = s7 - s10;
    float e_c1_p4 = s7 - s11;

    gauss_s1_c0[0] =  expf(g1_factor * (e_c0_m4 * e_c0_m4));
    gauss_s1_c0[1] =  expf(g1_factor * (e_c0_m3 * e_c0_m3));
    gauss_s1_c0[2] =  expf(g1_factor * (e_c0_m2 * e_c0_m2));
    gauss_s1_c0[3] =  expf(g1_factor * (e_c0_m1 * e_c0_m1));
    gauss_s1_c0[4] =  1.0f; //expf(g1_factor * (e_c0_z0 * e_c0_z0));
    gauss_s1_c0[5] =  expf(g1_factor * (e_c0_p1 * e_c0_p1));
    gauss_s1_c0[6] =  expf(g1_factor * (e_c0_p2 * e_c0_p2));
    gauss_s1_c0[7] =  expf(g1_factor * (e_c0_p3 * e_c0_p3));
    gauss_s1_c0[8] =  expf(g1_factor * (e_c0_p4 * e_c0_p4));

    gauss_s1_c1[0] =  expf(g1_factor * (e_c1_m4 * e_c1_m4));
    gauss_s1_c1[1] =  expf(g1_factor * (e_c1_m3 * e_c1_m3));
    gauss_s1_c1[2] =  expf(g1_factor * (e_c1_m2 * e_c1_m2));
    gauss_s1_c1[3] =  expf(g1_factor * (e_c1_m1 * e_c1_m1));
    gauss_s1_c1[4] =  1.0f; //expf(g1_factor * (e_c1_z0 * e_c1_z0));
    gauss_s1_c1[5] =  expf(g1_factor * (e_c1_p1 * e_c1_p1));
    gauss_s1_c1[6] =  expf(g1_factor * (e_c1_p2 * e_c1_p2));
    gauss_s1_c1[7] =  expf(g1_factor * (e_c1_p3 * e_c1_p3));
    gauss_s1_c1[8] =  expf(g1_factor * (e_c1_p4 * e_c1_p4));

    // calculate descriptor for this interest point
    for (int i=-8; i<8; i+=5) {

        float *i_arr;
        if (i == -8 || i == 7) {
            i_arr = gauss_s1_c1;
        } else {
            i_arr = gauss_s1_c0;
        } 

        int gauss_index_k_start = (i<0?8:0);
        int gauss_index_k_inc = (i<0?-1:1);

        for (int j=-8; j<8; j+=5) {

            float *j_arr;
            if (j == -8 || j == 7) {
                j_arr = gauss_s1_c1;
            } else {
                j_arr = gauss_s1_c0;
            } 

            float dx = 0.0f;
            float dy = 0.0f; 
            float mdx = 0.0f; 
            float mdy = 0.0f;

            int gauss_index_l = (j<0?8:0);
            int gauss_index_l_inc = (j<0?-1:1);
            for (int l = (j+8)*24; l < (j + 17)*24; l+=24, gauss_index_l+=gauss_index_l_inc) {
                float gauss_s1_y = j_arr[gauss_index_l];

                int gauss_index_k = gauss_index_k_start;
                for (int k = i+8; k < i + 17; ++k, gauss_index_k+=gauss_index_k_inc) {
                    
                    float gauss_s1_x = i_arr[gauss_index_k];

                    float gauss_s1 = gauss_s1_x * gauss_s1_y;

                    float rx = haarResponseX[l+k];
                    float ry = haarResponseY[l+k];
                    
                    //Get the gaussian weighted x and y responses on rotated axis
                    float rrx = gauss_s1 * ry;
                    float rry = gauss_s1 * rx;

                    dx += rrx;
                    dy += rry;
                    mdx += fabsf(rrx);
                    mdy += fabsf(rry);
                }
            }

            // Precomputed 4x4 gauss_s2 with (x,y) = {-1.5, -0.5, 0.5, 1.5}^2 and sig = 1.5f
            float gauss_s2 = gauss_s2_arr[gauss_s2_index];
            gauss_s2_index++;

            // add the values to the descriptor vector
            float d1 = dx * gauss_s2;
            float d2 = dy * gauss_s2;
            float d3 = mdx * gauss_s2;
            float d4 = mdy * gauss_s2;

            descriptor[desc_idx] = d1;
            descriptor[desc_idx+1] = d2;
            descriptor[desc_idx+2] = d3;
            descriptor[desc_idx+3] = d4;

            // precompute for normaliztion
            sum_of_squares += (d1*d1 + d2*d2 + d3*d3 + d4*d4);

            desc_idx += 4;

        }
    }

    // rescale to unit vector
    // NOTE: using sqrtf() for floats
    float norm_factor = 1.0f / sqrtf(sum_of_squares);

    for (int i = 0; i < 64; ++i) {
        descriptor[i] *= norm_factor;
    }
}